

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx::CurveNiIntersectorK<4,4>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  undefined8 uVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  uint uVar69;
  uint uVar70;
  undefined1 (*pauVar71) [32];
  ulong uVar72;
  uint uVar73;
  uint uVar74;
  long lVar75;
  ulong uVar76;
  ulong uVar77;
  int iVar78;
  float fVar79;
  float fVar106;
  float fVar108;
  vint4 bi_2;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  float fVar112;
  float fVar113;
  float fVar114;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  float fVar110;
  undefined1 auVar96 [32];
  float fVar107;
  float fVar109;
  float fVar111;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar84 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar115;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  float fVar141;
  vint4 bi_1;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar140;
  float fVar142;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  vint4 ai;
  undefined1 auVar143 [16];
  undefined1 auVar145 [16];
  undefined1 auVar147 [16];
  undefined1 auVar144 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar146 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  float fVar159;
  float fVar179;
  float fVar180;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [28];
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  float fVar187;
  float fVar204;
  float fVar205;
  vint4 bi;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [28];
  float fVar207;
  float fVar208;
  undefined1 auVar198 [32];
  float fVar206;
  float fVar209;
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar210;
  float fVar211;
  float fVar227;
  float fVar229;
  vint4 ai_2;
  undefined1 auVar212 [16];
  float fVar231;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar233;
  float fVar234;
  float fVar235;
  undefined1 auVar219 [32];
  float fVar228;
  float fVar230;
  float fVar232;
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  float fVar236;
  float fVar237;
  float fVar252;
  float fVar256;
  float fVar260;
  undefined1 auVar243 [32];
  float fVar238;
  float fVar253;
  float fVar257;
  float fVar261;
  float fVar264;
  float fVar267;
  float fVar270;
  undefined1 auVar244 [32];
  float fVar239;
  float fVar254;
  float fVar258;
  float fVar262;
  float fVar265;
  float fVar268;
  float fVar271;
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar251;
  float fVar255;
  undefined1 auVar240 [16];
  undefined1 auVar249 [32];
  float fVar259;
  float fVar263;
  float fVar266;
  float fVar269;
  undefined1 auVar250 [64];
  float fVar272;
  float fVar280;
  float fVar282;
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  float fVar285;
  float fVar289;
  float fVar292;
  float fVar295;
  undefined1 auVar277 [32];
  float fVar273;
  float fVar281;
  float fVar283;
  float fVar286;
  float fVar287;
  float fVar290;
  float fVar293;
  float fVar296;
  float fVar298;
  undefined1 auVar278 [32];
  float fVar284;
  float fVar288;
  float fVar291;
  float fVar294;
  float fVar297;
  undefined1 auVar279 [32];
  vint4 ai_1;
  undefined1 auVar299 [16];
  float fVar304;
  undefined1 auVar302 [32];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar303 [64];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  float fVar309;
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  float fVar310;
  float fVar318;
  undefined1 auVar311 [16];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  float fVar319;
  float fVar329;
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  undefined1 auVar322 [64];
  float fVar330;
  float fVar332;
  float fVar333;
  undefined1 auVar331 [16];
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar349;
  float fVar350;
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar355;
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  float fVar351;
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [16];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  float local_bc0;
  float local_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  float local_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  float local_a40;
  float fStack_a3c;
  float fStack_a38;
  float fStack_a34;
  RTCFilterFunctionNArguments local_a30;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 (*local_968) [16];
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  undefined1 auStack_950 [16];
  undefined1 local_940 [16];
  undefined1 local_930 [8];
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [32];
  ulong local_8e0;
  undefined1 auStack_8d8 [24];
  undefined1 local_8c0 [32];
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_810 [16];
  undefined1 local_800 [16];
  Primitive *local_7e8;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [16];
  undefined1 local_690 [16];
  RTCHitN local_680 [16];
  undefined1 auStack_670 [16];
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  undefined1 local_640 [16];
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  uint local_610;
  uint uStack_60c;
  uint uStack_608;
  uint uStack_604;
  undefined1 auStack_600 [16];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined4 uStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined4 uStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  
  PVar3 = prim[1];
  uVar76 = (ulong)(byte)PVar3;
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar210 = *(float *)(prim + uVar76 * 0x19 + 0x12);
  auVar9 = vsubps_avx(auVar9,*(undefined1 (*) [16])(prim + uVar76 * 0x19 + 6));
  auVar89._0_4_ = fVar210 * auVar9._0_4_;
  auVar89._4_4_ = fVar210 * auVar9._4_4_;
  auVar89._8_4_ = fVar210 * auVar9._8_4_;
  auVar89._12_4_ = fVar210 * auVar9._12_4_;
  auVar274._0_4_ = fVar210 * auVar10._0_4_;
  auVar274._4_4_ = fVar210 * auVar10._4_4_;
  auVar274._8_4_ = fVar210 * auVar10._8_4_;
  auVar274._12_4_ = fVar210 * auVar10._12_4_;
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 4 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 5 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 6 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar117 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0xb + 6)));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar76 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  uVar77 = (ulong)(uint)((int)(uVar76 * 9) * 2);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 + uVar76 + 6)));
  auVar82 = vcvtdq2ps_avx(auVar82);
  uVar77 = (ulong)(uint)((int)(uVar76 * 5) << 2);
  auVar116 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 + 6)));
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar80 = vshufps_avx(auVar274,auVar274,0);
  auVar118 = vshufps_avx(auVar274,auVar274,0x55);
  auVar143 = vshufps_avx(auVar274,auVar274,0xaa);
  fVar210 = auVar143._0_4_;
  fVar159 = auVar143._4_4_;
  fVar227 = auVar143._8_4_;
  fVar179 = auVar143._12_4_;
  fVar236 = auVar118._0_4_;
  fVar251 = auVar118._4_4_;
  fVar255 = auVar118._8_4_;
  fVar259 = auVar118._12_4_;
  fVar229 = auVar80._0_4_;
  fVar180 = auVar80._4_4_;
  fVar231 = auVar80._8_4_;
  fVar181 = auVar80._12_4_;
  auVar331._0_4_ = fVar229 * auVar9._0_4_ + fVar236 * auVar10._0_4_ + fVar210 * auVar19._0_4_;
  auVar331._4_4_ = fVar180 * auVar9._4_4_ + fVar251 * auVar10._4_4_ + fVar159 * auVar19._4_4_;
  auVar331._8_4_ = fVar231 * auVar9._8_4_ + fVar255 * auVar10._8_4_ + fVar227 * auVar19._8_4_;
  auVar331._12_4_ = fVar181 * auVar9._12_4_ + fVar259 * auVar10._12_4_ + fVar179 * auVar19._12_4_;
  auVar340._0_4_ = fVar229 * auVar117._0_4_ + fVar236 * auVar20._0_4_ + auVar21._0_4_ * fVar210;
  auVar340._4_4_ = fVar180 * auVar117._4_4_ + fVar251 * auVar20._4_4_ + auVar21._4_4_ * fVar159;
  auVar340._8_4_ = fVar231 * auVar117._8_4_ + fVar255 * auVar20._8_4_ + auVar21._8_4_ * fVar227;
  auVar340._12_4_ = fVar181 * auVar117._12_4_ + fVar259 * auVar20._12_4_ + auVar21._12_4_ * fVar179;
  auVar275._0_4_ = fVar229 * auVar81._0_4_ + fVar236 * auVar82._0_4_ + auVar116._0_4_ * fVar210;
  auVar275._4_4_ = fVar180 * auVar81._4_4_ + fVar251 * auVar82._4_4_ + auVar116._4_4_ * fVar159;
  auVar275._8_4_ = fVar231 * auVar81._8_4_ + fVar255 * auVar82._8_4_ + auVar116._8_4_ * fVar227;
  auVar275._12_4_ = fVar181 * auVar81._12_4_ + fVar259 * auVar82._12_4_ + auVar116._12_4_ * fVar179;
  auVar80 = vshufps_avx(auVar89,auVar89,0);
  auVar118 = vshufps_avx(auVar89,auVar89,0x55);
  auVar143 = vshufps_avx(auVar89,auVar89,0xaa);
  fVar210 = auVar143._0_4_;
  fVar159 = auVar143._4_4_;
  fVar227 = auVar143._8_4_;
  fVar179 = auVar143._12_4_;
  fVar236 = auVar118._0_4_;
  fVar251 = auVar118._4_4_;
  fVar255 = auVar118._8_4_;
  fVar259 = auVar118._12_4_;
  fVar229 = auVar80._0_4_;
  fVar180 = auVar80._4_4_;
  fVar231 = auVar80._8_4_;
  fVar181 = auVar80._12_4_;
  auVar188._0_4_ = fVar229 * auVar9._0_4_ + fVar236 * auVar10._0_4_ + fVar210 * auVar19._0_4_;
  auVar188._4_4_ = fVar180 * auVar9._4_4_ + fVar251 * auVar10._4_4_ + fVar159 * auVar19._4_4_;
  auVar188._8_4_ = fVar231 * auVar9._8_4_ + fVar255 * auVar10._8_4_ + fVar227 * auVar19._8_4_;
  auVar188._12_4_ = fVar181 * auVar9._12_4_ + fVar259 * auVar10._12_4_ + fVar179 * auVar19._12_4_;
  auVar118._0_4_ = fVar229 * auVar117._0_4_ + auVar21._0_4_ * fVar210 + fVar236 * auVar20._0_4_;
  auVar118._4_4_ = fVar180 * auVar117._4_4_ + auVar21._4_4_ * fVar159 + fVar251 * auVar20._4_4_;
  auVar118._8_4_ = fVar231 * auVar117._8_4_ + auVar21._8_4_ * fVar227 + fVar255 * auVar20._8_4_;
  auVar118._12_4_ = fVar181 * auVar117._12_4_ + auVar21._12_4_ * fVar179 + fVar259 * auVar20._12_4_;
  auVar80._0_4_ = fVar229 * auVar81._0_4_ + fVar236 * auVar82._0_4_ + auVar116._0_4_ * fVar210;
  auVar80._4_4_ = fVar180 * auVar81._4_4_ + fVar251 * auVar82._4_4_ + auVar116._4_4_ * fVar159;
  auVar80._8_4_ = fVar231 * auVar81._8_4_ + fVar255 * auVar82._8_4_ + auVar116._8_4_ * fVar227;
  auVar80._12_4_ = fVar181 * auVar81._12_4_ + fVar259 * auVar82._12_4_ + auVar116._12_4_ * fVar179;
  auVar240._8_4_ = 0x7fffffff;
  auVar240._0_8_ = 0x7fffffff7fffffff;
  auVar240._12_4_ = 0x7fffffff;
  auVar9 = vandps_avx(auVar331,auVar240);
  auVar160._8_4_ = 0x219392ef;
  auVar160._0_8_ = 0x219392ef219392ef;
  auVar160._12_4_ = 0x219392ef;
  auVar9 = vcmpps_avx(auVar9,auVar160,1);
  auVar10 = vblendvps_avx(auVar331,auVar160,auVar9);
  auVar9 = vandps_avx(auVar340,auVar240);
  auVar9 = vcmpps_avx(auVar9,auVar160,1);
  auVar19 = vblendvps_avx(auVar340,auVar160,auVar9);
  auVar9 = vandps_avx(auVar275,auVar240);
  auVar9 = vcmpps_avx(auVar9,auVar160,1);
  auVar9 = vblendvps_avx(auVar275,auVar160,auVar9);
  auVar117 = vrcpps_avx(auVar10);
  fVar236 = auVar117._0_4_;
  auVar143._0_4_ = fVar236 * auVar10._0_4_;
  fVar251 = auVar117._4_4_;
  auVar143._4_4_ = fVar251 * auVar10._4_4_;
  fVar255 = auVar117._8_4_;
  auVar143._8_4_ = fVar255 * auVar10._8_4_;
  fVar259 = auVar117._12_4_;
  auVar143._12_4_ = fVar259 * auVar10._12_4_;
  auVar276._8_4_ = 0x3f800000;
  auVar276._0_8_ = 0x3f8000003f800000;
  auVar276._12_4_ = 0x3f800000;
  auVar10 = vsubps_avx(auVar276,auVar143);
  fVar236 = fVar236 + fVar236 * auVar10._0_4_;
  fVar251 = fVar251 + fVar251 * auVar10._4_4_;
  fVar255 = fVar255 + fVar255 * auVar10._8_4_;
  fVar259 = fVar259 + fVar259 * auVar10._12_4_;
  auVar10 = vrcpps_avx(auVar19);
  fVar210 = auVar10._0_4_;
  auVar212._0_4_ = fVar210 * auVar19._0_4_;
  fVar227 = auVar10._4_4_;
  auVar212._4_4_ = fVar227 * auVar19._4_4_;
  fVar229 = auVar10._8_4_;
  auVar212._8_4_ = fVar229 * auVar19._8_4_;
  fVar231 = auVar10._12_4_;
  auVar212._12_4_ = fVar231 * auVar19._12_4_;
  auVar10 = vsubps_avx(auVar276,auVar212);
  fVar210 = fVar210 + fVar210 * auVar10._0_4_;
  fVar227 = fVar227 + fVar227 * auVar10._4_4_;
  fVar229 = fVar229 + fVar229 * auVar10._8_4_;
  fVar231 = fVar231 + fVar231 * auVar10._12_4_;
  auVar10 = vrcpps_avx(auVar9);
  fVar159 = auVar10._0_4_;
  auVar161._0_4_ = fVar159 * auVar9._0_4_;
  fVar179 = auVar10._4_4_;
  auVar161._4_4_ = fVar179 * auVar9._4_4_;
  fVar180 = auVar10._8_4_;
  auVar161._8_4_ = fVar180 * auVar9._8_4_;
  fVar181 = auVar10._12_4_;
  auVar161._12_4_ = fVar181 * auVar9._12_4_;
  auVar9 = vsubps_avx(auVar276,auVar161);
  fVar159 = fVar159 + fVar159 * auVar9._0_4_;
  fVar179 = fVar179 + fVar179 * auVar9._4_4_;
  fVar180 = fVar180 + fVar180 * auVar9._8_4_;
  fVar181 = fVar181 + fVar181 * auVar9._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar76 * 7 + 6);
  auVar9 = vpmovsxwd_avx(auVar9);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar188);
  auVar147._0_4_ = fVar236 * auVar9._0_4_;
  auVar147._4_4_ = fVar251 * auVar9._4_4_;
  auVar147._8_4_ = fVar255 * auVar9._8_4_;
  auVar147._12_4_ = fVar259 * auVar9._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar76 * 9 + 6);
  auVar9 = vpmovsxwd_avx(auVar10);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar188);
  auVar91._0_4_ = fVar236 * auVar9._0_4_;
  auVar91._4_4_ = fVar251 * auVar9._4_4_;
  auVar91._8_4_ = fVar255 * auVar9._8_4_;
  auVar91._12_4_ = fVar259 * auVar9._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar10 = vpmovsxwd_avx(auVar19);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar76 * -2 + 6);
  auVar9 = vpmovsxwd_avx(auVar117);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar118);
  auVar299._0_4_ = auVar9._0_4_ * fVar210;
  auVar299._4_4_ = auVar9._4_4_ * fVar227;
  auVar299._8_4_ = auVar9._8_4_ * fVar229;
  auVar299._12_4_ = auVar9._12_4_ * fVar231;
  auVar9 = vcvtdq2ps_avx(auVar10);
  auVar9 = vsubps_avx(auVar9,auVar118);
  auVar116._0_4_ = fVar210 * auVar9._0_4_;
  auVar116._4_4_ = fVar227 * auVar9._4_4_;
  auVar116._8_4_ = fVar229 * auVar9._8_4_;
  auVar116._12_4_ = fVar231 * auVar9._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar77 + uVar76 + 6);
  auVar9 = vpmovsxwd_avx(auVar20);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar80);
  auVar213._0_4_ = auVar9._0_4_ * fVar159;
  auVar213._4_4_ = auVar9._4_4_ * fVar179;
  auVar213._8_4_ = auVar9._8_4_ * fVar180;
  auVar213._12_4_ = auVar9._12_4_ * fVar181;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar76 * 0x17 + 6);
  auVar9 = vpmovsxwd_avx(auVar21);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar80);
  auVar81._0_4_ = auVar9._0_4_ * fVar159;
  auVar81._4_4_ = auVar9._4_4_ * fVar179;
  auVar81._8_4_ = auVar9._8_4_ * fVar180;
  auVar81._12_4_ = auVar9._12_4_ * fVar181;
  auVar9 = vpminsd_avx(auVar147,auVar91);
  auVar10 = vpminsd_avx(auVar299,auVar116);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  auVar10 = vpminsd_avx(auVar213,auVar81);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar305._4_4_ = uVar1;
  auVar305._0_4_ = uVar1;
  auVar305._8_4_ = uVar1;
  auVar305._12_4_ = uVar1;
  auVar10 = vmaxps_avx(auVar10,auVar305);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  local_4a0._0_4_ = auVar9._0_4_ * 0.99999964;
  local_4a0._4_4_ = auVar9._4_4_ * 0.99999964;
  local_4a0._8_4_ = auVar9._8_4_ * 0.99999964;
  local_4a0._12_4_ = auVar9._12_4_ * 0.99999964;
  auVar9 = vpmaxsd_avx(auVar147,auVar91);
  auVar10 = vpmaxsd_avx(auVar299,auVar116);
  auVar9 = vminps_avx(auVar9,auVar10);
  auVar10 = vpmaxsd_avx(auVar213,auVar81);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar144._4_4_ = uVar1;
  auVar144._0_4_ = uVar1;
  auVar144._8_4_ = uVar1;
  auVar144._12_4_ = uVar1;
  auVar10 = vminps_avx(auVar10,auVar144);
  auVar9 = vminps_avx(auVar9,auVar10);
  auVar82._0_4_ = auVar9._0_4_ * 1.0000004;
  auVar82._4_4_ = auVar9._4_4_ * 1.0000004;
  auVar82._8_4_ = auVar9._8_4_ * 1.0000004;
  auVar82._12_4_ = auVar9._12_4_ * 1.0000004;
  auVar9 = vpshufd_avx(ZEXT116((byte)PVar3),0);
  auVar10 = vpcmpgtd_avx(auVar9,_DAT_01f7fcf0);
  auVar9 = vcmpps_avx(local_4a0,auVar82,2);
  auVar9 = vandps_avx(auVar9,auVar10);
  uVar69 = vmovmskps_avx(auVar9);
  if (uVar69 == 0) {
    return;
  }
  uVar69 = uVar69 & 0xff;
  auVar94._16_16_ = mm_lookupmask_ps._240_16_;
  auVar94._0_16_ = mm_lookupmask_ps._240_16_;
  local_400 = vblendps_avx(auVar94,ZEXT832(0) << 0x20,0x80);
  local_968 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_7e8 = prim;
LAB_00ea28d6:
  uVar77 = (ulong)uVar69;
  lVar75 = 0;
  if (uVar77 != 0) {
    for (; (uVar69 >> lVar75 & 1) == 0; lVar75 = lVar75 + 1) {
    }
  }
  uVar77 = uVar77 - 1 & uVar77;
  uVar69 = *(uint *)(local_7e8 + 2);
  local_8e0 = (ulong)*(uint *)(local_7e8 + lVar75 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar69].ptr;
  uVar76 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_8e0);
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar6 = *(long *)&pGVar4[1].time_range.upper;
  auVar9 = *(undefined1 (*) [16])(lVar6 + (long)p_Var5 * uVar76);
  auVar10 = *(undefined1 (*) [16])(lVar6 + (uVar76 + 1) * (long)p_Var5);
  auVar19 = *(undefined1 (*) [16])(lVar6 + (uVar76 + 2) * (long)p_Var5);
  lVar7 = 0;
  if (uVar77 != 0) {
    for (; (uVar77 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
    }
  }
  auVar117 = *(undefined1 (*) [16])(lVar6 + (uVar76 + 3) * (long)p_Var5);
  if (((uVar77 != 0) && (uVar76 = uVar77 - 1 & uVar77, uVar76 != 0)) && (lVar6 = 0, uVar76 != 0)) {
    for (; (uVar76 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
    }
  }
  auVar20 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar21 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar210 = *(float *)(ray + k * 4 + 0x40);
  auVar311._4_4_ = fVar210;
  auVar311._0_4_ = fVar210;
  auVar311._8_4_ = fVar210;
  auVar311._12_4_ = fVar210;
  fStack_730 = fVar210;
  _local_740 = auVar311;
  fStack_72c = fVar210;
  fStack_728 = fVar210;
  fStack_724 = fVar210;
  fVar159 = *(float *)(ray + k * 4 + 0x50);
  auVar341._4_4_ = fVar159;
  auVar341._0_4_ = fVar159;
  auVar341._8_4_ = fVar159;
  auVar341._12_4_ = fVar159;
  fStack_750 = fVar159;
  _local_760 = auVar341;
  fStack_74c = fVar159;
  fStack_748 = fVar159;
  fStack_744 = fVar159;
  auVar20 = vunpcklps_avx(auVar311,auVar341);
  fVar227 = *(float *)(ray + k * 4 + 0x60);
  auVar361._4_4_ = fVar227;
  auVar361._0_4_ = fVar227;
  auVar361._8_4_ = fVar227;
  auVar361._12_4_ = fVar227;
  fStack_710 = fVar227;
  _local_720 = auVar361;
  fStack_70c = fVar227;
  fStack_708 = fVar227;
  register0x000015dc = fVar227;
  _local_930 = vinsertps_avx(auVar20,auVar361,0x28);
  auVar83._0_4_ = (auVar9._0_4_ + auVar10._0_4_ + auVar19._0_4_ + auVar117._0_4_) * 0.25;
  auVar83._4_4_ = (auVar9._4_4_ + auVar10._4_4_ + auVar19._4_4_ + auVar117._4_4_) * 0.25;
  auVar83._8_4_ = (auVar9._8_4_ + auVar10._8_4_ + auVar19._8_4_ + auVar117._8_4_) * 0.25;
  auVar83._12_4_ = (auVar9._12_4_ + auVar10._12_4_ + auVar19._12_4_ + auVar117._12_4_) * 0.25;
  auVar20 = vsubps_avx(auVar83,auVar21);
  auVar20 = vdpps_avx(auVar20,_local_930,0x7f);
  local_940 = vdpps_avx(_local_930,_local_930,0x7f);
  auVar81 = vrcpss_avx(local_940,local_940);
  fVar179 = auVar20._0_4_ * auVar81._0_4_ * (2.0 - local_940._0_4_ * auVar81._0_4_);
  auVar81 = vshufps_avx(ZEXT416((uint)fVar179),ZEXT416((uint)fVar179),0);
  auVar214._0_4_ = auVar21._0_4_ + local_930._0_4_ * auVar81._0_4_;
  auVar214._4_4_ = auVar21._4_4_ + local_930._4_4_ * auVar81._4_4_;
  auVar214._8_4_ = auVar21._8_4_ + local_930._8_4_ * auVar81._8_4_;
  auVar214._12_4_ = auVar21._12_4_ + local_930._12_4_ * auVar81._12_4_;
  auVar20 = vblendps_avx(auVar214,_DAT_01f7aa10,8);
  auVar21 = vsubps_avx(auVar9,auVar20);
  auVar82 = vsubps_avx(auVar19,auVar20);
  auVar116 = vsubps_avx(auVar10,auVar20);
  auVar80 = vsubps_avx(auVar117,auVar20);
  auVar9 = vshufps_avx(auVar21,auVar21,0);
  auVar10 = vshufps_avx(auVar21,auVar21,0x55);
  local_9a0._16_16_ = auVar10;
  local_9a0._0_16_ = auVar10;
  auVar322 = ZEXT3264(local_9a0);
  auVar10 = vshufps_avx(auVar21,auVar21,0xaa);
  auVar19 = vshufps_avx(auVar21,auVar21,0xff);
  auVar117 = vshufps_avx(auVar116,auVar116,0);
  auVar219._16_16_ = auVar117;
  auVar219._0_16_ = auVar117;
  auVar117 = vshufps_avx(auVar116,auVar116,0x55);
  register0x00001290 = auVar117;
  _local_1e0 = auVar117;
  auVar117 = vshufps_avx(auVar116,auVar116,0xaa);
  local_9c0._16_16_ = auVar117;
  local_9c0._0_16_ = auVar117;
  auVar250 = ZEXT3264(local_9c0);
  auVar117 = vshufps_avx(auVar116,auVar116,0xff);
  local_9e0._16_16_ = auVar117;
  local_9e0._0_16_ = auVar117;
  auVar303 = ZEXT3264(local_9e0);
  auVar117 = vshufps_avx(auVar82,auVar82,0);
  local_2e0._16_16_ = auVar117;
  local_2e0._0_16_ = auVar117;
  auVar117 = vshufps_avx(auVar82,auVar82,0x55);
  local_300._16_16_ = auVar117;
  local_300._0_16_ = auVar117;
  auVar117 = vshufps_avx(auVar82,auVar82,0xaa);
  register0x00001290 = auVar117;
  _local_200 = auVar117;
  auVar117 = vshufps_avx(auVar82,auVar82,0xff);
  register0x00001290 = auVar117;
  _local_220 = auVar117;
  auVar117 = vshufps_avx(auVar80,auVar80,0);
  register0x00001290 = auVar117;
  _local_240 = auVar117;
  auVar117 = vshufps_avx(auVar80,auVar80,0x55);
  register0x00001290 = auVar117;
  _local_260 = auVar117;
  auVar117 = vshufps_avx(auVar80,auVar80,0xaa);
  register0x00001290 = auVar117;
  _local_280 = auVar117;
  auVar117 = vshufps_avx(auVar80,auVar80,0xff);
  register0x00001290 = auVar117;
  _local_2a0 = auVar117;
  auVar117 = ZEXT416((uint)(fVar210 * fVar210 + fVar159 * fVar159 + fVar227 * fVar227));
  auVar117 = vshufps_avx(auVar117,auVar117,0);
  local_2c0._16_16_ = auVar117;
  local_2c0._0_16_ = auVar117;
  fVar210 = *(float *)(ray + k * 4 + 0x30);
  local_810 = ZEXT416((uint)fVar179);
  auVar117 = vshufps_avx(ZEXT416((uint)(fVar210 - fVar179)),ZEXT416((uint)(fVar210 - fVar179)),0);
  local_320._16_16_ = auVar117;
  local_320._0_16_ = auVar117;
  local_690 = vpshufd_avx(ZEXT416(uVar69),0);
  local_6a0 = vpshufd_avx(ZEXT416(*(uint *)(local_7e8 + lVar75 * 4 + 6)),0);
  local_c00 = auVar81._0_8_;
  uStack_bf8 = auVar81._8_8_;
  local_8a0 = local_c00;
  uStack_898 = uStack_bf8;
  uStack_890 = local_c00;
  uStack_888 = uStack_bf8;
  local_c08 = 1;
  uVar76 = 0;
  auVar95._8_4_ = 0x7fffffff;
  auVar95._0_8_ = 0x7fffffff7fffffff;
  auVar95._12_4_ = 0x7fffffff;
  auVar95._16_4_ = 0x7fffffff;
  auVar95._20_4_ = 0x7fffffff;
  auVar95._24_4_ = 0x7fffffff;
  auVar95._28_4_ = 0x7fffffff;
  local_440 = vandps_avx(local_2c0,auVar95);
  auVar117 = vsqrtss_avx(local_940,local_940);
  auVar20 = vsqrtss_avx(local_940,local_940);
  local_490 = ZEXT816(0x3f80000000000000);
  local_420 = auVar219;
  do {
    auVar198._8_4_ = 0x3f800000;
    auVar198._0_8_ = 0x3f8000003f800000;
    auVar198._12_4_ = 0x3f800000;
    auVar198._16_4_ = 0x3f800000;
    auVar198._20_4_ = 0x3f800000;
    iVar78 = (int)uVar76;
    auVar198._24_4_ = 0x3f800000;
    auVar198._28_4_ = 0x3f800000;
    auVar81 = vmovshdup_avx(local_490);
    auVar143 = vsubps_avx(auVar81,local_490);
    auVar81 = vshufps_avx(local_490,local_490,0);
    local_6c0._16_16_ = auVar81;
    local_6c0._0_16_ = auVar81;
    auVar118 = vshufps_avx(auVar143,auVar143,0);
    local_6e0._16_16_ = auVar118;
    local_6e0._0_16_ = auVar118;
    fVar115 = auVar118._0_4_;
    fVar140 = auVar118._4_4_;
    fVar141 = auVar118._8_4_;
    fVar142 = auVar118._12_4_;
    fVar79 = auVar81._0_4_;
    auVar131._0_4_ = fVar79 + fVar115 * 0.0;
    fVar106 = auVar81._4_4_;
    auVar131._4_4_ = fVar106 + fVar140 * 0.14285715;
    fVar108 = auVar81._8_4_;
    auVar131._8_4_ = fVar108 + fVar141 * 0.2857143;
    fVar110 = auVar81._12_4_;
    auVar131._12_4_ = fVar110 + fVar142 * 0.42857146;
    auVar131._16_4_ = fVar79 + fVar115 * 0.5714286;
    auVar131._20_4_ = fVar106 + fVar140 * 0.71428573;
    auVar131._24_4_ = fVar108 + fVar141 * 0.8571429;
    auVar131._28_4_ = fVar110 + fVar142;
    auVar94 = vsubps_avx(auVar198,auVar131);
    fVar236 = auVar219._28_4_;
    fVar159 = auVar94._0_4_;
    fVar227 = auVar94._4_4_;
    fVar179 = auVar94._8_4_;
    fVar229 = auVar94._12_4_;
    fVar285 = auVar9._12_4_;
    fVar180 = auVar94._16_4_;
    fVar231 = auVar94._20_4_;
    fVar181 = auVar94._24_4_;
    fVar186 = fVar285 + 1.0;
    fVar304 = fVar236 + fVar186;
    fVar237 = local_2e0._0_4_ * auVar131._0_4_ + auVar219._0_4_ * fVar159;
    fVar252 = local_2e0._4_4_ * auVar131._4_4_ + auVar219._4_4_ * fVar227;
    fVar256 = local_2e0._8_4_ * auVar131._8_4_ + auVar219._8_4_ * fVar179;
    fVar260 = local_2e0._12_4_ * auVar131._12_4_ + auVar219._12_4_ * fVar229;
    fVar263 = local_2e0._16_4_ * auVar131._16_4_ + auVar219._16_4_ * fVar180;
    fVar266 = local_2e0._20_4_ * auVar131._20_4_ + auVar219._20_4_ * fVar231;
    fVar269 = local_2e0._24_4_ * auVar131._24_4_ + auVar219._24_4_ * fVar181;
    fVar251 = local_300._0_4_ * auVar131._0_4_ + (float)local_1e0._0_4_ * fVar159;
    fVar255 = local_300._4_4_ * auVar131._4_4_ + (float)local_1e0._4_4_ * fVar227;
    fVar259 = local_300._8_4_ * auVar131._8_4_ + fStack_1d8 * fVar179;
    fVar182 = local_300._12_4_ * auVar131._12_4_ + fStack_1d4 * fVar229;
    fVar183 = local_300._16_4_ * auVar131._16_4_ + fStack_1d0 * fVar180;
    fVar184 = local_300._20_4_ * auVar131._20_4_ + fStack_1cc * fVar231;
    fVar185 = local_300._24_4_ * auVar131._24_4_ + fStack_1c8 * fVar181;
    fVar187 = (float)local_200._0_4_ * auVar131._0_4_ + auVar250._0_4_ * fVar159;
    fVar204 = (float)local_200._4_4_ * auVar131._4_4_ + auVar250._4_4_ * fVar227;
    fVar205 = fStack_1f8 * auVar131._8_4_ + auVar250._8_4_ * fVar179;
    fVar206 = fStack_1f4 * auVar131._12_4_ + auVar250._12_4_ * fVar229;
    fVar207 = fStack_1f0 * auVar131._16_4_ + auVar250._16_4_ * fVar180;
    fVar208 = fStack_1ec * auVar131._20_4_ + auVar250._20_4_ * fVar231;
    fVar209 = fStack_1e8 * auVar131._24_4_ + auVar250._24_4_ * fVar181;
    fVar211 = (float)local_220._0_4_ * auVar131._0_4_ + auVar303._0_4_ * fVar159;
    fVar228 = (float)local_220._4_4_ * auVar131._4_4_ + auVar303._4_4_ * fVar227;
    fVar230 = fStack_218 * auVar131._8_4_ + auVar303._8_4_ * fVar179;
    fVar232 = fStack_214 * auVar131._12_4_ + auVar303._12_4_ * fVar229;
    fVar233 = fStack_210 * auVar131._16_4_ + auVar303._16_4_ * fVar180;
    fVar234 = fStack_20c * auVar131._20_4_ + auVar303._20_4_ * fVar231;
    fVar235 = fStack_208 * auVar131._24_4_ + auVar303._24_4_ * fVar181;
    fVar329 = auVar322._28_4_;
    fVar355 = fVar329 + local_2e0._28_4_;
    fVar338 = auVar303._28_4_ + fVar329;
    auVar307._0_4_ =
         fVar159 * (auVar219._0_4_ * auVar131._0_4_ + auVar9._0_4_ * fVar159) +
         auVar131._0_4_ * fVar237;
    auVar307._4_4_ =
         fVar227 * (auVar219._4_4_ * auVar131._4_4_ + auVar9._4_4_ * fVar227) +
         auVar131._4_4_ * fVar252;
    auVar307._8_4_ =
         fVar179 * (auVar219._8_4_ * auVar131._8_4_ + auVar9._8_4_ * fVar179) +
         auVar131._8_4_ * fVar256;
    auVar307._12_4_ =
         fVar229 * (auVar219._12_4_ * auVar131._12_4_ + fVar285 * fVar229) +
         auVar131._12_4_ * fVar260;
    auVar307._16_4_ =
         fVar180 * (auVar219._16_4_ * auVar131._16_4_ + auVar9._0_4_ * fVar180) +
         auVar131._16_4_ * fVar263;
    auVar307._20_4_ =
         fVar231 * (auVar219._20_4_ * auVar131._20_4_ + auVar9._4_4_ * fVar231) +
         auVar131._20_4_ * fVar266;
    auVar307._24_4_ =
         fVar181 * (auVar219._24_4_ * auVar131._24_4_ + auVar9._8_4_ * fVar181) +
         auVar131._24_4_ * fVar269;
    auVar307._28_4_ = fStack_1e4 + fVar329;
    auVar312._0_4_ =
         fVar159 * ((float)local_1e0._0_4_ * auVar131._0_4_ + auVar322._0_4_ * fVar159) +
         auVar131._0_4_ * fVar251;
    auVar312._4_4_ =
         fVar227 * ((float)local_1e0._4_4_ * auVar131._4_4_ + auVar322._4_4_ * fVar227) +
         auVar131._4_4_ * fVar255;
    auVar312._8_4_ =
         fVar179 * (fStack_1d8 * auVar131._8_4_ + auVar322._8_4_ * fVar179) +
         auVar131._8_4_ * fVar259;
    auVar312._12_4_ =
         fVar229 * (fStack_1d4 * auVar131._12_4_ + auVar322._12_4_ * fVar229) +
         auVar131._12_4_ * fVar182;
    auVar312._16_4_ =
         fVar180 * (fStack_1d0 * auVar131._16_4_ + auVar322._16_4_ * fVar180) +
         auVar131._16_4_ * fVar183;
    auVar312._20_4_ =
         fVar231 * (fStack_1cc * auVar131._20_4_ + auVar322._20_4_ * fVar231) +
         auVar131._20_4_ * fVar184;
    auVar312._24_4_ =
         fVar181 * (fStack_1c8 * auVar131._24_4_ + auVar322._24_4_ * fVar181) +
         auVar131._24_4_ * fVar185;
    auVar312._28_4_ = fStack_204 + fVar329;
    auVar320._0_4_ =
         (auVar250._0_4_ * auVar131._0_4_ + auVar10._0_4_ * fVar159) * fVar159 +
         auVar131._0_4_ * fVar187;
    auVar320._4_4_ =
         (auVar250._4_4_ * auVar131._4_4_ + auVar10._4_4_ * fVar227) * fVar227 +
         auVar131._4_4_ * fVar204;
    auVar320._8_4_ =
         (auVar250._8_4_ * auVar131._8_4_ + auVar10._8_4_ * fVar179) * fVar179 +
         auVar131._8_4_ * fVar205;
    auVar320._12_4_ =
         (auVar250._12_4_ * auVar131._12_4_ + auVar10._12_4_ * fVar229) * fVar229 +
         auVar131._12_4_ * fVar206;
    auVar320._16_4_ =
         (auVar250._16_4_ * auVar131._16_4_ + auVar10._0_4_ * fVar180) * fVar180 +
         auVar131._16_4_ * fVar207;
    auVar320._20_4_ =
         (auVar250._20_4_ * auVar131._20_4_ + auVar10._4_4_ * fVar231) * fVar231 +
         auVar131._20_4_ * fVar208;
    auVar320._24_4_ =
         (auVar250._24_4_ * auVar131._24_4_ + auVar10._8_4_ * fVar181) * fVar181 +
         auVar131._24_4_ * fVar209;
    auVar320._28_4_ = fVar304 + fVar329;
    auVar277._0_4_ =
         auVar131._0_4_ * fVar211 +
         fVar159 * (auVar303._0_4_ * auVar131._0_4_ + auVar19._0_4_ * fVar159);
    auVar277._4_4_ =
         auVar131._4_4_ * fVar228 +
         fVar227 * (auVar303._4_4_ * auVar131._4_4_ + auVar19._4_4_ * fVar227);
    auVar277._8_4_ =
         auVar131._8_4_ * fVar230 +
         fVar179 * (auVar303._8_4_ * auVar131._8_4_ + auVar19._8_4_ * fVar179);
    auVar277._12_4_ =
         auVar131._12_4_ * fVar232 +
         fVar229 * (auVar303._12_4_ * auVar131._12_4_ + auVar19._12_4_ * fVar229);
    auVar277._16_4_ =
         auVar131._16_4_ * fVar233 +
         fVar180 * (auVar303._16_4_ * auVar131._16_4_ + auVar19._0_4_ * fVar180);
    auVar277._20_4_ =
         auVar131._20_4_ * fVar234 +
         fVar231 * (auVar303._20_4_ * auVar131._20_4_ + auVar19._4_4_ * fVar231);
    auVar277._24_4_ =
         auVar131._24_4_ * fVar235 +
         fVar181 * (auVar303._24_4_ * auVar131._24_4_ + auVar19._8_4_ * fVar181);
    auVar277._28_4_ = fVar304 + fVar285;
    auVar243._0_4_ =
         (auVar131._0_4_ * (float)local_240._0_4_ + local_2e0._0_4_ * fVar159) * auVar131._0_4_ +
         fVar159 * fVar237;
    auVar243._4_4_ =
         (auVar131._4_4_ * (float)local_240._4_4_ + local_2e0._4_4_ * fVar227) * auVar131._4_4_ +
         fVar227 * fVar252;
    auVar243._8_4_ =
         (auVar131._8_4_ * fStack_238 + local_2e0._8_4_ * fVar179) * auVar131._8_4_ +
         fVar179 * fVar256;
    auVar243._12_4_ =
         (auVar131._12_4_ * fStack_234 + local_2e0._12_4_ * fVar229) * auVar131._12_4_ +
         fVar229 * fVar260;
    auVar243._16_4_ =
         (auVar131._16_4_ * fStack_230 + local_2e0._16_4_ * fVar180) * auVar131._16_4_ +
         fVar180 * fVar263;
    auVar243._20_4_ =
         (auVar131._20_4_ * fStack_22c + local_2e0._20_4_ * fVar231) * auVar131._20_4_ +
         fVar231 * fVar266;
    auVar243._24_4_ =
         (auVar131._24_4_ * fStack_228 + local_2e0._24_4_ * fVar181) * auVar131._24_4_ +
         fVar181 * fVar269;
    auVar243._28_4_ = fVar304 + fVar186 + auVar250._28_4_;
    auVar175._0_4_ =
         (auVar131._0_4_ * (float)local_260._0_4_ + local_300._0_4_ * fVar159) * auVar131._0_4_ +
         fVar159 * fVar251;
    auVar175._4_4_ =
         (auVar131._4_4_ * (float)local_260._4_4_ + local_300._4_4_ * fVar227) * auVar131._4_4_ +
         fVar227 * fVar255;
    auVar175._8_4_ =
         (auVar131._8_4_ * fStack_258 + local_300._8_4_ * fVar179) * auVar131._8_4_ +
         fVar179 * fVar259;
    auVar175._12_4_ =
         (auVar131._12_4_ * fStack_254 + local_300._12_4_ * fVar229) * auVar131._12_4_ +
         fVar229 * fVar182;
    auVar175._16_4_ =
         (auVar131._16_4_ * fStack_250 + local_300._16_4_ * fVar180) * auVar131._16_4_ +
         fVar180 * fVar183;
    auVar175._20_4_ =
         (auVar131._20_4_ * fStack_24c + local_300._20_4_ * fVar231) * auVar131._20_4_ +
         fVar231 * fVar184;
    auVar175._24_4_ =
         (auVar131._24_4_ * fStack_248 + local_300._24_4_ * fVar181) * auVar131._24_4_ +
         fVar181 * fVar185;
    auVar175._28_4_ = fVar304 + fVar236 + fVar186;
    auVar199._0_4_ =
         (auVar131._0_4_ * (float)local_280._0_4_ + (float)local_200._0_4_ * fVar159) *
         auVar131._0_4_ + fVar159 * fVar187;
    auVar199._4_4_ =
         (auVar131._4_4_ * (float)local_280._4_4_ + (float)local_200._4_4_ * fVar227) *
         auVar131._4_4_ + fVar227 * fVar204;
    auVar199._8_4_ =
         (auVar131._8_4_ * fStack_278 + fStack_1f8 * fVar179) * auVar131._8_4_ + fVar179 * fVar205;
    auVar199._12_4_ =
         (auVar131._12_4_ * fStack_274 + fStack_1f4 * fVar229) * auVar131._12_4_ + fVar229 * fVar206
    ;
    auVar199._16_4_ =
         (auVar131._16_4_ * fStack_270 + fStack_1f0 * fVar180) * auVar131._16_4_ + fVar180 * fVar207
    ;
    auVar199._20_4_ =
         (auVar131._20_4_ * fStack_26c + fStack_1ec * fVar231) * auVar131._20_4_ + fVar231 * fVar208
    ;
    auVar199._24_4_ =
         (auVar131._24_4_ * fStack_268 + fStack_1e8 * fVar181) * auVar131._24_4_ + fVar181 * fVar209
    ;
    auVar199._28_4_ = fVar338 + fVar285 + auVar250._28_4_;
    auVar220._0_4_ =
         (auVar131._0_4_ * (float)local_2a0._0_4_ + (float)local_220._0_4_ * fVar159) *
         auVar131._0_4_ + fVar159 * fVar211;
    auVar220._4_4_ =
         (auVar131._4_4_ * (float)local_2a0._4_4_ + (float)local_220._4_4_ * fVar227) *
         auVar131._4_4_ + fVar227 * fVar228;
    auVar220._8_4_ =
         (auVar131._8_4_ * fStack_298 + fStack_218 * fVar179) * auVar131._8_4_ + fVar179 * fVar230;
    auVar220._12_4_ =
         (auVar131._12_4_ * fStack_294 + fStack_214 * fVar229) * auVar131._12_4_ + fVar229 * fVar232
    ;
    auVar220._16_4_ =
         (auVar131._16_4_ * fStack_290 + fStack_210 * fVar180) * auVar131._16_4_ + fVar180 * fVar233
    ;
    auVar220._20_4_ =
         (auVar131._20_4_ * fStack_28c + fStack_20c * fVar231) * auVar131._20_4_ + fVar231 * fVar234
    ;
    auVar220._24_4_ =
         (auVar131._24_4_ * fStack_288 + fStack_208 * fVar181) * auVar131._24_4_ + fVar181 * fVar235
    ;
    auVar220._28_4_ = fVar355 + fVar329 + fVar236;
    auVar342._0_4_ = auVar307._0_4_ * fVar159 + auVar131._0_4_ * auVar243._0_4_;
    auVar342._4_4_ = auVar307._4_4_ * fVar227 + auVar131._4_4_ * auVar243._4_4_;
    auVar342._8_4_ = auVar307._8_4_ * fVar179 + auVar131._8_4_ * auVar243._8_4_;
    auVar342._12_4_ = auVar307._12_4_ * fVar229 + auVar131._12_4_ * auVar243._12_4_;
    auVar342._16_4_ = auVar307._16_4_ * fVar180 + auVar131._16_4_ * auVar243._16_4_;
    auVar342._20_4_ = auVar307._20_4_ * fVar231 + auVar131._20_4_ * auVar243._20_4_;
    auVar342._24_4_ = auVar307._24_4_ * fVar181 + auVar131._24_4_ * auVar243._24_4_;
    auVar342._28_4_ = fVar355 + fVar304;
    auVar356._0_4_ = auVar312._0_4_ * fVar159 + auVar131._0_4_ * auVar175._0_4_;
    auVar356._4_4_ = auVar312._4_4_ * fVar227 + auVar131._4_4_ * auVar175._4_4_;
    auVar356._8_4_ = auVar312._8_4_ * fVar179 + auVar131._8_4_ * auVar175._8_4_;
    auVar356._12_4_ = auVar312._12_4_ * fVar229 + auVar131._12_4_ * auVar175._12_4_;
    auVar356._16_4_ = auVar312._16_4_ * fVar180 + auVar131._16_4_ * auVar175._16_4_;
    auVar356._20_4_ = auVar312._20_4_ * fVar231 + auVar131._20_4_ * auVar175._20_4_;
    auVar356._24_4_ = auVar312._24_4_ * fVar181 + auVar131._24_4_ * auVar175._24_4_;
    auVar356._28_4_ = fVar304 + fVar338;
    local_5c0._0_4_ = auVar320._0_4_ * fVar159 + auVar131._0_4_ * auVar199._0_4_;
    local_5c0._4_4_ = auVar320._4_4_ * fVar227 + auVar131._4_4_ * auVar199._4_4_;
    fStack_5b8 = auVar320._8_4_ * fVar179 + auVar131._8_4_ * auVar199._8_4_;
    fStack_5b4 = auVar320._12_4_ * fVar229 + auVar131._12_4_ * auVar199._12_4_;
    fStack_5b0 = auVar320._16_4_ * fVar180 + auVar131._16_4_ * auVar199._16_4_;
    fStack_5ac = auVar320._20_4_ * fVar231 + auVar131._20_4_ * auVar199._20_4_;
    fStack_5a8 = auVar320._24_4_ * fVar181 + auVar131._24_4_ * auVar199._24_4_;
    fStack_5a4 = fVar338 + fVar304;
    local_bc0 = auVar143._0_4_;
    local_700._0_4_ = fVar159 * auVar277._0_4_ + auVar131._0_4_ * auVar220._0_4_;
    local_700._4_4_ = fVar227 * auVar277._4_4_ + auVar131._4_4_ * auVar220._4_4_;
    local_700._8_4_ = fVar179 * auVar277._8_4_ + auVar131._8_4_ * auVar220._8_4_;
    local_700._12_4_ = fVar229 * auVar277._12_4_ + auVar131._12_4_ * auVar220._12_4_;
    local_700._16_4_ = fVar180 * auVar277._16_4_ + auVar131._16_4_ * auVar220._16_4_;
    local_700._20_4_ = fVar231 * auVar277._20_4_ + auVar131._20_4_ * auVar220._20_4_;
    local_700._24_4_ = fVar181 * auVar277._24_4_ + auVar131._24_4_ * auVar220._24_4_;
    local_700._28_4_ = auVar94._28_4_ + auVar131._28_4_;
    auVar94 = vsubps_avx(auVar243,auVar307);
    auVar219 = vsubps_avx(auVar175,auVar312);
    auVar95 = vsubps_avx(auVar199,auVar320);
    auVar131 = vsubps_avx(auVar220,auVar277);
    auVar81 = vshufps_avx(ZEXT416((uint)(local_bc0 * 0.04761905)),
                          ZEXT416((uint)(local_bc0 * 0.04761905)),0);
    fVar231 = auVar81._0_4_;
    fVar238 = fVar231 * auVar94._0_4_ * 3.0;
    fVar236 = auVar81._4_4_;
    fVar253 = fVar236 * auVar94._4_4_ * 3.0;
    local_960._4_4_ = fVar253;
    local_960._0_4_ = fVar238;
    fVar184 = auVar81._8_4_;
    fVar257 = fVar184 * auVar94._8_4_ * 3.0;
    fStack_958 = fVar257;
    fVar206 = auVar81._12_4_;
    fVar261 = fVar206 * auVar94._12_4_ * 3.0;
    fStack_954 = fVar261;
    fVar264 = fVar231 * auVar94._16_4_ * 3.0;
    unique0x1000765c = fVar264;
    fVar267 = fVar236 * auVar94._20_4_ * 3.0;
    unique0x10007660 = fVar267;
    fVar270 = fVar184 * auVar94._24_4_ * 3.0;
    unique0x10007664 = fVar270;
    unique0x10007668 = auVar243._28_4_;
    fVar272 = fVar231 * auVar219._0_4_ * 3.0;
    fVar280 = fVar236 * auVar219._4_4_ * 3.0;
    auVar279._4_4_ = fVar280;
    auVar279._0_4_ = fVar272;
    fVar282 = fVar184 * auVar219._8_4_ * 3.0;
    auVar279._8_4_ = fVar282;
    fVar286 = fVar206 * auVar219._12_4_ * 3.0;
    auVar279._12_4_ = fVar286;
    fVar289 = fVar231 * auVar219._16_4_ * 3.0;
    auVar279._16_4_ = fVar289;
    fVar292 = fVar236 * auVar219._20_4_ * 3.0;
    auVar279._20_4_ = fVar292;
    fVar295 = fVar184 * auVar219._24_4_ * 3.0;
    auVar279._24_4_ = fVar295;
    auVar279._28_4_ = auVar277._28_4_;
    fVar330 = fVar231 * auVar95._0_4_ * 3.0;
    fVar332 = fVar236 * auVar95._4_4_ * 3.0;
    auVar28._4_4_ = fVar332;
    auVar28._0_4_ = fVar330;
    fVar333 = fVar184 * auVar95._8_4_ * 3.0;
    auVar28._8_4_ = fVar333;
    fVar334 = fVar206 * auVar95._12_4_ * 3.0;
    auVar28._12_4_ = fVar334;
    fVar335 = fVar231 * auVar95._16_4_ * 3.0;
    auVar28._16_4_ = fVar335;
    fVar336 = fVar236 * auVar95._20_4_ * 3.0;
    auVar28._20_4_ = fVar336;
    fVar337 = fVar184 * auVar95._24_4_ * 3.0;
    auVar28._24_4_ = fVar337;
    auVar28._28_4_ = fVar338;
    fVar181 = fVar231 * auVar131._0_4_ * 3.0;
    fVar183 = fVar236 * auVar131._4_4_ * 3.0;
    auVar151._4_4_ = fVar183;
    auVar151._0_4_ = fVar181;
    fVar185 = fVar184 * auVar131._8_4_ * 3.0;
    auVar151._8_4_ = fVar185;
    fVar207 = fVar206 * auVar131._12_4_ * 3.0;
    auVar151._12_4_ = fVar207;
    fVar231 = fVar231 * auVar131._16_4_ * 3.0;
    auVar151._16_4_ = fVar231;
    fVar236 = fVar236 * auVar131._20_4_ * 3.0;
    auVar151._20_4_ = fVar236;
    fVar184 = fVar184 * auVar131._24_4_ * 3.0;
    auVar151._24_4_ = fVar184;
    auVar151._28_4_ = fVar206;
    auVar94 = vperm2f128_avx(auVar356,auVar356,1);
    auVar94 = vshufps_avx(auVar94,auVar356,0x30);
    auVar131 = vshufps_avx(auVar356,auVar94,0x29);
    auVar94 = vperm2f128_avx(_local_5c0,_local_5c0,1);
    auVar94 = vshufps_avx(auVar94,_local_5c0,0x30);
    local_a00 = vshufps_avx(_local_5c0,auVar94,0x29);
    auVar219 = vsubps_avx(local_700,auVar151);
    auVar94 = vperm2f128_avx(auVar219,auVar219,1);
    auVar94 = vshufps_avx(auVar94,auVar219,0x30);
    auVar151 = vshufps_avx(auVar219,auVar94,0x29);
    local_540 = vsubps_avx(auVar131,auVar356);
    local_520 = vsubps_avx(local_a00,_local_5c0);
    fVar227 = local_540._0_4_;
    fVar251 = local_540._4_4_;
    auVar22._4_4_ = fVar332 * fVar251;
    auVar22._0_4_ = fVar330 * fVar227;
    fVar186 = local_540._8_4_;
    auVar22._8_4_ = fVar333 * fVar186;
    fVar209 = local_540._12_4_;
    auVar22._12_4_ = fVar334 * fVar209;
    fVar235 = local_540._16_4_;
    auVar22._16_4_ = fVar335 * fVar235;
    fVar269 = local_540._20_4_;
    auVar22._20_4_ = fVar336 * fVar269;
    fVar12 = local_540._24_4_;
    auVar22._24_4_ = fVar337 * fVar12;
    auVar22._28_4_ = auVar219._28_4_;
    fVar319 = local_520._0_4_;
    fVar323 = local_520._4_4_;
    auVar348._4_4_ = fVar323 * fVar280;
    auVar348._0_4_ = fVar319 * fVar272;
    fVar324 = local_520._8_4_;
    auVar348._8_4_ = fVar324 * fVar282;
    fVar325 = local_520._12_4_;
    auVar348._12_4_ = fVar325 * fVar286;
    fVar326 = local_520._16_4_;
    auVar348._16_4_ = fVar326 * fVar289;
    fVar327 = local_520._20_4_;
    auVar348._20_4_ = fVar327 * fVar292;
    fVar328 = local_520._24_4_;
    auVar348._24_4_ = fVar328 * fVar295;
    auVar348._28_4_ = auVar94._28_4_;
    auVar348 = vsubps_avx(auVar348,auVar22);
    auVar94 = vperm2f128_avx(auVar342,auVar342,1);
    auVar94 = vshufps_avx(auVar94,auVar342,0x30);
    auVar22 = vshufps_avx(auVar342,auVar94,0x29);
    local_560 = vsubps_avx(auVar22,auVar342);
    auVar24._4_4_ = fVar323 * fVar253;
    auVar24._0_4_ = fVar319 * fVar238;
    auVar24._8_4_ = fVar324 * fVar257;
    auVar24._12_4_ = fVar325 * fVar261;
    auVar24._16_4_ = fVar326 * fVar264;
    auVar24._20_4_ = fVar327 * fVar267;
    auVar24._24_4_ = fVar328 * fVar270;
    auVar24._28_4_ = auVar22._28_4_;
    fVar179 = local_560._0_4_;
    fVar255 = local_560._4_4_;
    auVar25._4_4_ = fVar332 * fVar255;
    auVar25._0_4_ = fVar330 * fVar179;
    fVar187 = local_560._8_4_;
    auVar25._8_4_ = fVar333 * fVar187;
    fVar211 = local_560._12_4_;
    auVar25._12_4_ = fVar334 * fVar211;
    fVar237 = local_560._16_4_;
    auVar25._16_4_ = fVar335 * fVar237;
    fVar285 = local_560._20_4_;
    auVar25._20_4_ = fVar336 * fVar285;
    fVar13 = local_560._24_4_;
    auVar25._24_4_ = fVar337 * fVar13;
    auVar25._28_4_ = local_a00._28_4_;
    auVar24 = vsubps_avx(auVar25,auVar24);
    auVar26._4_4_ = fVar255 * fVar280;
    auVar26._0_4_ = fVar179 * fVar272;
    auVar26._8_4_ = fVar187 * fVar282;
    auVar26._12_4_ = fVar211 * fVar286;
    auVar26._16_4_ = fVar237 * fVar289;
    auVar26._20_4_ = fVar285 * fVar292;
    auVar26._24_4_ = fVar13 * fVar295;
    auVar26._28_4_ = local_a00._28_4_;
    auVar27._4_4_ = fVar253 * fVar251;
    auVar27._0_4_ = fVar238 * fVar227;
    auVar27._8_4_ = fVar257 * fVar186;
    auVar27._12_4_ = fVar261 * fVar209;
    auVar27._16_4_ = fVar264 * fVar235;
    auVar27._20_4_ = fVar267 * fVar269;
    auVar27._24_4_ = fVar270 * fVar12;
    auVar27._28_4_ = auVar312._28_4_;
    auVar25 = vsubps_avx(auVar27,auVar26);
    fVar159 = auVar25._28_4_;
    auVar150._0_4_ = fVar179 * fVar179 + fVar227 * fVar227 + fVar319 * fVar319;
    auVar150._4_4_ = fVar255 * fVar255 + fVar251 * fVar251 + fVar323 * fVar323;
    auVar150._8_4_ = fVar187 * fVar187 + fVar186 * fVar186 + fVar324 * fVar324;
    auVar150._12_4_ = fVar211 * fVar211 + fVar209 * fVar209 + fVar325 * fVar325;
    auVar150._16_4_ = fVar237 * fVar237 + fVar235 * fVar235 + fVar326 * fVar326;
    auVar150._20_4_ = fVar285 * fVar285 + fVar269 * fVar269 + fVar327 * fVar327;
    auVar150._24_4_ = fVar13 * fVar13 + fVar12 * fVar12 + fVar328 * fVar328;
    auVar150._28_4_ = fVar159 + fVar159 + auVar348._28_4_;
    auVar94 = vrcpps_avx(auVar150);
    fVar208 = auVar94._0_4_;
    fVar232 = auVar94._4_4_;
    auVar8._4_4_ = fVar232 * auVar150._4_4_;
    auVar8._0_4_ = fVar208 * auVar150._0_4_;
    fVar233 = auVar94._8_4_;
    auVar8._8_4_ = fVar233 * auVar150._8_4_;
    fVar234 = auVar94._12_4_;
    auVar8._12_4_ = fVar234 * auVar150._12_4_;
    fVar260 = auVar94._16_4_;
    auVar8._16_4_ = fVar260 * auVar150._16_4_;
    fVar263 = auVar94._20_4_;
    auVar8._20_4_ = fVar263 * auVar150._20_4_;
    fVar266 = auVar94._24_4_;
    auVar8._24_4_ = fVar266 * auVar150._24_4_;
    auVar8._28_4_ = auVar312._28_4_;
    auVar343._8_4_ = 0x3f800000;
    auVar343._0_8_ = 0x3f8000003f800000;
    auVar343._12_4_ = 0x3f800000;
    auVar343._16_4_ = 0x3f800000;
    auVar343._20_4_ = 0x3f800000;
    auVar343._24_4_ = 0x3f800000;
    auVar343._28_4_ = 0x3f800000;
    auVar26 = vsubps_avx(auVar343,auVar8);
    fVar208 = auVar26._0_4_ * fVar208 + fVar208;
    fVar232 = auVar26._4_4_ * fVar232 + fVar232;
    fVar233 = auVar26._8_4_ * fVar233 + fVar233;
    fVar234 = auVar26._12_4_ * fVar234 + fVar234;
    fVar260 = auVar26._16_4_ * fVar260 + fVar260;
    fVar263 = auVar26._20_4_ * fVar263 + fVar263;
    fVar266 = auVar26._24_4_ * fVar266 + fVar266;
    auVar219 = vperm2f128_avx(auVar279,auVar279,1);
    auVar219 = vshufps_avx(auVar219,auVar279,0x30);
    auVar219 = vshufps_avx(auVar279,auVar219,0x29);
    auVar95 = vperm2f128_avx(auVar28,auVar28,1);
    auVar95 = vshufps_avx(auVar95,auVar28,0x30);
    local_8c0 = vshufps_avx(auVar28,auVar95,0x29);
    fVar339 = local_8c0._0_4_;
    fVar349 = local_8c0._4_4_;
    auVar23._4_4_ = fVar349 * fVar251;
    auVar23._0_4_ = fVar339 * fVar227;
    fVar350 = local_8c0._8_4_;
    auVar23._8_4_ = fVar350 * fVar186;
    fVar351 = local_8c0._12_4_;
    auVar23._12_4_ = fVar351 * fVar209;
    fVar352 = local_8c0._16_4_;
    auVar23._16_4_ = fVar352 * fVar235;
    fVar353 = local_8c0._20_4_;
    auVar23._20_4_ = fVar353 * fVar269;
    fVar354 = local_8c0._24_4_;
    auVar23._24_4_ = fVar354 * fVar12;
    auVar23._28_4_ = auVar95._28_4_;
    fVar229 = auVar219._0_4_;
    fVar259 = auVar219._4_4_;
    auVar29._4_4_ = fVar323 * fVar259;
    auVar29._0_4_ = fVar319 * fVar229;
    fVar204 = auVar219._8_4_;
    auVar29._8_4_ = fVar324 * fVar204;
    fVar228 = auVar219._12_4_;
    auVar29._12_4_ = fVar325 * fVar228;
    fVar252 = auVar219._16_4_;
    auVar29._16_4_ = fVar326 * fVar252;
    fVar304 = auVar219._20_4_;
    auVar29._20_4_ = fVar327 * fVar304;
    fVar14 = auVar219._24_4_;
    auVar29._24_4_ = fVar328 * fVar14;
    auVar29._28_4_ = fVar338;
    auVar95 = vsubps_avx(auVar29,auVar23);
    auVar219 = vperm2f128_avx(_local_960,_local_960,1);
    auVar219 = vshufps_avx(auVar219,_local_960,0x30);
    local_880 = vshufps_avx(_local_960,auVar219,0x29);
    fVar180 = local_880._0_4_;
    fVar182 = local_880._4_4_;
    auVar30._4_4_ = fVar323 * fVar182;
    auVar30._0_4_ = fVar319 * fVar180;
    fVar205 = local_880._8_4_;
    auVar30._8_4_ = fVar324 * fVar205;
    fVar230 = local_880._12_4_;
    auVar30._12_4_ = fVar325 * fVar230;
    fVar256 = local_880._16_4_;
    auVar30._16_4_ = fVar326 * fVar256;
    fVar329 = local_880._20_4_;
    auVar30._20_4_ = fVar327 * fVar329;
    fVar15 = local_880._24_4_;
    auVar30._24_4_ = fVar328 * fVar15;
    auVar30._28_4_ = auVar219._28_4_;
    auVar31._4_4_ = fVar349 * fVar255;
    auVar31._0_4_ = fVar339 * fVar179;
    auVar31._8_4_ = fVar350 * fVar187;
    auVar31._12_4_ = fVar351 * fVar211;
    auVar31._16_4_ = fVar352 * fVar237;
    auVar31._20_4_ = fVar353 * fVar285;
    uVar73 = local_8c0._28_4_;
    auVar31._24_4_ = fVar354 * fVar13;
    auVar31._28_4_ = uVar73;
    auVar219 = vsubps_avx(auVar31,auVar30);
    auVar32._4_4_ = fVar255 * fVar259;
    auVar32._0_4_ = fVar179 * fVar229;
    auVar32._8_4_ = fVar187 * fVar204;
    auVar32._12_4_ = fVar211 * fVar228;
    auVar32._16_4_ = fVar237 * fVar252;
    auVar32._20_4_ = fVar285 * fVar304;
    auVar32._24_4_ = fVar13 * fVar14;
    auVar32._28_4_ = uVar73;
    auVar33._4_4_ = fVar182 * fVar251;
    auVar33._0_4_ = fVar180 * fVar227;
    auVar33._8_4_ = fVar205 * fVar186;
    auVar33._12_4_ = fVar230 * fVar209;
    auVar33._16_4_ = fVar256 * fVar235;
    auVar33._20_4_ = fVar329 * fVar269;
    auVar33._24_4_ = fVar15 * fVar12;
    auVar33._28_4_ = auVar356._28_4_;
    auVar279 = vsubps_avx(auVar33,auVar32);
    auVar34._4_4_ =
         (auVar348._4_4_ * auVar348._4_4_ +
         auVar24._4_4_ * auVar24._4_4_ + auVar25._4_4_ * auVar25._4_4_) * fVar232;
    auVar34._0_4_ =
         (auVar348._0_4_ * auVar348._0_4_ +
         auVar24._0_4_ * auVar24._0_4_ + auVar25._0_4_ * auVar25._0_4_) * fVar208;
    auVar34._8_4_ =
         (auVar348._8_4_ * auVar348._8_4_ +
         auVar24._8_4_ * auVar24._8_4_ + auVar25._8_4_ * auVar25._8_4_) * fVar233;
    auVar34._12_4_ =
         (auVar348._12_4_ * auVar348._12_4_ +
         auVar24._12_4_ * auVar24._12_4_ + auVar25._12_4_ * auVar25._12_4_) * fVar234;
    auVar34._16_4_ =
         (auVar348._16_4_ * auVar348._16_4_ +
         auVar24._16_4_ * auVar24._16_4_ + auVar25._16_4_ * auVar25._16_4_) * fVar260;
    auVar34._20_4_ =
         (auVar348._20_4_ * auVar348._20_4_ +
         auVar24._20_4_ * auVar24._20_4_ + auVar25._20_4_ * auVar25._20_4_) * fVar263;
    auVar34._24_4_ =
         (auVar348._24_4_ * auVar348._24_4_ +
         auVar24._24_4_ * auVar24._24_4_ + auVar25._24_4_ * auVar25._24_4_) * fVar266;
    auVar34._28_4_ = auVar348._28_4_ + auVar24._28_4_ + fVar159;
    auVar35._4_4_ =
         (auVar95._4_4_ * auVar95._4_4_ +
         auVar219._4_4_ * auVar219._4_4_ + auVar279._4_4_ * auVar279._4_4_) * fVar232;
    auVar35._0_4_ =
         (auVar95._0_4_ * auVar95._0_4_ +
         auVar219._0_4_ * auVar219._0_4_ + auVar279._0_4_ * auVar279._0_4_) * fVar208;
    auVar35._8_4_ =
         (auVar95._8_4_ * auVar95._8_4_ +
         auVar219._8_4_ * auVar219._8_4_ + auVar279._8_4_ * auVar279._8_4_) * fVar233;
    auVar35._12_4_ =
         (auVar95._12_4_ * auVar95._12_4_ +
         auVar219._12_4_ * auVar219._12_4_ + auVar279._12_4_ * auVar279._12_4_) * fVar234;
    auVar35._16_4_ =
         (auVar95._16_4_ * auVar95._16_4_ +
         auVar219._16_4_ * auVar219._16_4_ + auVar279._16_4_ * auVar279._16_4_) * fVar260;
    auVar35._20_4_ =
         (auVar95._20_4_ * auVar95._20_4_ +
         auVar219._20_4_ * auVar219._20_4_ + auVar279._20_4_ * auVar279._20_4_) * fVar263;
    auVar35._24_4_ =
         (auVar95._24_4_ * auVar95._24_4_ +
         auVar219._24_4_ * auVar219._24_4_ + auVar279._24_4_ * auVar279._24_4_) * fVar266;
    auVar35._28_4_ = auVar26._28_4_ + auVar94._28_4_;
    auVar94 = vmaxps_avx(auVar34,auVar35);
    auVar219 = vperm2f128_avx(local_700,local_700,1);
    auVar219 = vshufps_avx(auVar219,local_700,0x30);
    auVar348 = vshufps_avx(local_700,auVar219,0x29);
    auVar96._0_4_ = (float)local_700._0_4_ + fVar181;
    auVar96._4_4_ = local_700._4_4_ + fVar183;
    auVar96._8_4_ = local_700._8_4_ + fVar185;
    auVar96._12_4_ = local_700._12_4_ + fVar207;
    auVar96._16_4_ = local_700._16_4_ + fVar231;
    auVar96._20_4_ = local_700._20_4_ + fVar236;
    auVar96._24_4_ = local_700._24_4_ + fVar184;
    auVar96._28_4_ = local_700._28_4_ + fVar206;
    auVar219 = vmaxps_avx(local_700,auVar96);
    auVar95 = vmaxps_avx(auVar151,auVar348);
    auVar219 = vmaxps_avx(auVar219,auVar95);
    auVar95 = vrsqrtps_avx(auVar150);
    fVar159 = auVar95._0_4_;
    fVar231 = auVar95._4_4_;
    fVar181 = auVar95._8_4_;
    fVar236 = auVar95._12_4_;
    fVar183 = auVar95._16_4_;
    fVar184 = auVar95._20_4_;
    fVar185 = auVar95._24_4_;
    local_340 = fVar159 * 1.5 + fVar159 * fVar159 * fVar159 * auVar150._0_4_ * -0.5;
    fStack_33c = fVar231 * 1.5 + fVar231 * fVar231 * fVar231 * auVar150._4_4_ * -0.5;
    fStack_338 = fVar181 * 1.5 + fVar181 * fVar181 * fVar181 * auVar150._8_4_ * -0.5;
    fStack_334 = fVar236 * 1.5 + fVar236 * fVar236 * fVar236 * auVar150._12_4_ * -0.5;
    fStack_330 = fVar183 * 1.5 + fVar183 * fVar183 * fVar183 * auVar150._16_4_ * -0.5;
    fStack_32c = fVar184 * 1.5 + fVar184 * fVar184 * fVar184 * auVar150._20_4_ * -0.5;
    fStack_328 = fVar185 * 1.5 + fVar185 * fVar185 * fVar185 * auVar150._24_4_ * -0.5;
    auVar24 = vsubps_avx(ZEXT832(0) << 0x20,auVar356);
    auVar25 = vsubps_avx(ZEXT832(0) << 0x20,_local_5c0);
    fVar231 = auVar25._0_4_;
    fVar183 = auVar25._4_4_;
    fVar206 = auVar25._8_4_;
    fVar232 = auVar25._12_4_;
    fVar260 = auVar25._16_4_;
    fVar338 = auVar25._20_4_;
    fVar16 = auVar25._24_4_;
    fVar181 = auVar24._0_4_;
    fVar184 = auVar24._4_4_;
    fVar207 = auVar24._8_4_;
    fVar233 = auVar24._12_4_;
    fVar263 = auVar24._16_4_;
    fVar355 = auVar24._20_4_;
    fVar17 = auVar24._24_4_;
    auVar26 = vsubps_avx(ZEXT832(0) << 0x20,auVar342);
    fVar236 = auVar26._0_4_;
    fVar185 = auVar26._4_4_;
    fVar208 = auVar26._8_4_;
    fVar234 = auVar26._12_4_;
    fVar266 = auVar26._16_4_;
    fVar11 = auVar26._20_4_;
    fVar18 = auVar26._24_4_;
    auVar344._0_4_ =
         (float)local_740._0_4_ * fVar236 +
         (float)local_760._0_4_ * fVar181 + (float)local_720._0_4_ * fVar231;
    auVar344._4_4_ =
         (float)local_740._4_4_ * fVar185 +
         (float)local_760._4_4_ * fVar184 + (float)local_720._4_4_ * fVar183;
    auVar344._8_4_ = fStack_738 * fVar208 + fStack_758 * fVar207 + fStack_718 * fVar206;
    auVar344._12_4_ = fStack_734 * fVar234 + fStack_754 * fVar233 + fStack_714 * fVar232;
    auVar344._16_4_ = fStack_730 * fVar266 + fStack_750 * fVar263 + fStack_710 * fVar260;
    auVar344._20_4_ = fStack_72c * fVar11 + fStack_74c * fVar355 + fStack_70c * fVar338;
    auVar344._24_4_ = fStack_728 * fVar18 + fStack_748 * fVar17 + fStack_708 * fVar16;
    auVar344._28_4_ = auVar356._28_4_ + auVar279._28_4_ + 1.5;
    auVar357._0_4_ = fVar236 * fVar236 + fVar181 * fVar181 + fVar231 * fVar231;
    auVar357._4_4_ = fVar185 * fVar185 + fVar184 * fVar184 + fVar183 * fVar183;
    auVar357._8_4_ = fVar208 * fVar208 + fVar207 * fVar207 + fVar206 * fVar206;
    auVar357._12_4_ = fVar234 * fVar234 + fVar233 * fVar233 + fVar232 * fVar232;
    auVar357._16_4_ = fVar266 * fVar266 + fVar263 * fVar263 + fVar260 * fVar260;
    auVar357._20_4_ = fVar11 * fVar11 + fVar355 * fVar355 + fVar338 * fVar338;
    auVar357._24_4_ = fVar18 * fVar18 + fVar17 * fVar17 + fVar16 * fVar16;
    auVar357._28_4_ = fStack_5a4 + fStack_5a4 + auVar356._28_4_;
    local_480 = (float)local_740._0_4_ * fVar179 * local_340 +
                local_340 * fVar227 * (float)local_760._0_4_ +
                (float)local_720._0_4_ * fVar319 * local_340;
    fStack_47c = (float)local_740._4_4_ * fVar255 * fStack_33c +
                 fStack_33c * fVar251 * (float)local_760._4_4_ +
                 (float)local_720._4_4_ * fVar323 * fStack_33c;
    fStack_478 = fStack_738 * fVar187 * fStack_338 +
                 fStack_338 * fVar186 * fStack_758 + fStack_718 * fVar324 * fStack_338;
    fStack_474 = fStack_734 * fVar211 * fStack_334 +
                 fStack_334 * fVar209 * fStack_754 + fStack_714 * fVar325 * fStack_334;
    fStack_470 = fStack_730 * fVar237 * fStack_330 +
                 fStack_330 * fVar235 * fStack_750 + fStack_710 * fVar326 * fStack_330;
    fStack_46c = fStack_72c * fVar285 * fStack_32c +
                 fStack_32c * fVar269 * fStack_74c + fStack_70c * fVar327 * fStack_32c;
    fStack_468 = fStack_728 * fVar13 * fStack_328 +
                 fStack_328 * fVar12 * fStack_748 + fStack_708 * fVar328 * fStack_328;
    fVar159 = fStack_724 + fStack_744 + 0.0;
    fVar273 = fVar236 * fVar179 * local_340 +
              local_340 * fVar227 * fVar181 + fVar319 * local_340 * fVar231;
    fVar281 = fVar185 * fVar255 * fStack_33c +
              fStack_33c * fVar251 * fVar184 + fVar323 * fStack_33c * fVar183;
    fVar283 = fVar208 * fVar187 * fStack_338 +
              fStack_338 * fVar186 * fVar207 + fVar324 * fStack_338 * fVar206;
    fVar287 = fVar234 * fVar211 * fStack_334 +
              fStack_334 * fVar209 * fVar233 + fVar325 * fStack_334 * fVar232;
    fVar290 = fVar266 * fVar237 * fStack_330 +
              fStack_330 * fVar235 * fVar263 + fVar326 * fStack_330 * fVar260;
    fVar293 = fVar11 * fVar285 * fStack_32c +
              fStack_32c * fVar269 * fVar355 + fVar327 * fStack_32c * fVar338;
    fVar296 = fVar18 * fVar13 * fStack_328 +
              fStack_328 * fVar12 * fVar17 + fVar328 * fStack_328 * fVar16;
    fVar298 = fStack_744 + fVar159;
    auVar36._4_4_ = fStack_47c * fVar281;
    auVar36._0_4_ = local_480 * fVar273;
    auVar36._8_4_ = fStack_478 * fVar283;
    auVar36._12_4_ = fStack_474 * fVar287;
    auVar36._16_4_ = fStack_470 * fVar290;
    auVar36._20_4_ = fStack_46c * fVar293;
    auVar36._24_4_ = fStack_468 * fVar296;
    auVar36._28_4_ = fVar159;
    auVar279 = vsubps_avx(auVar344,auVar36);
    auVar37._4_4_ = fVar281 * fVar281;
    auVar37._0_4_ = fVar273 * fVar273;
    auVar37._8_4_ = fVar283 * fVar283;
    auVar37._12_4_ = fVar287 * fVar287;
    auVar37._16_4_ = fVar290 * fVar290;
    auVar37._20_4_ = fVar293 * fVar293;
    auVar37._24_4_ = fVar296 * fVar296;
    auVar37._28_4_ = fStack_744;
    auVar27 = vsubps_avx(auVar357,auVar37);
    local_500 = vsqrtps_avx(auVar94);
    fVar159 = (local_500._0_4_ + auVar219._0_4_) * 1.0000002;
    fVar107 = (local_500._4_4_ + auVar219._4_4_) * 1.0000002;
    fVar109 = (local_500._8_4_ + auVar219._8_4_) * 1.0000002;
    fVar111 = (local_500._12_4_ + auVar219._12_4_) * 1.0000002;
    fVar112 = (local_500._16_4_ + auVar219._16_4_) * 1.0000002;
    fVar113 = (local_500._20_4_ + auVar219._20_4_) * 1.0000002;
    fVar114 = (local_500._24_4_ + auVar219._24_4_) * 1.0000002;
    auVar38._4_4_ = fVar107 * fVar107;
    auVar38._0_4_ = fVar159 * fVar159;
    auVar38._8_4_ = fVar109 * fVar109;
    auVar38._12_4_ = fVar111 * fVar111;
    auVar38._16_4_ = fVar112 * fVar112;
    auVar38._20_4_ = fVar113 * fVar113;
    auVar38._24_4_ = fVar114 * fVar114;
    auVar38._28_4_ = local_500._28_4_ + auVar219._28_4_;
    fVar310 = auVar279._0_4_ + auVar279._0_4_;
    fVar318 = auVar279._4_4_ + auVar279._4_4_;
    local_900._0_8_ = CONCAT44(fVar318,fVar310);
    local_900._8_4_ = auVar279._8_4_ + auVar279._8_4_;
    local_900._12_4_ = auVar279._12_4_ + auVar279._12_4_;
    local_900._16_4_ = auVar279._16_4_ + auVar279._16_4_;
    local_900._20_4_ = auVar279._20_4_ + auVar279._20_4_;
    local_900._24_4_ = auVar279._24_4_ + auVar279._24_4_;
    local_900._28_4_ = auVar279._28_4_ + auVar279._28_4_;
    auVar219 = vsubps_avx(auVar27,auVar38);
    local_360._4_4_ = fStack_47c * fStack_47c;
    local_360._0_4_ = local_480 * local_480;
    local_360._8_4_ = fStack_478 * fStack_478;
    local_360._12_4_ = fStack_474 * fStack_474;
    local_360._16_4_ = fStack_470 * fStack_470;
    local_360._20_4_ = fStack_46c * fStack_46c;
    local_360._24_4_ = fStack_468 * fStack_468;
    local_360._28_4_ = local_520._28_4_;
    local_460 = vsubps_avx(local_2c0,local_360);
    auVar39._4_4_ = fVar318 * fVar318;
    auVar39._0_4_ = fVar310 * fVar310;
    auVar39._8_4_ = local_900._8_4_ * local_900._8_4_;
    auVar39._12_4_ = local_900._12_4_ * local_900._12_4_;
    auVar39._16_4_ = local_900._16_4_ * local_900._16_4_;
    auVar39._20_4_ = local_900._20_4_ * local_900._20_4_;
    auVar39._24_4_ = local_900._24_4_ * local_900._24_4_;
    auVar39._28_4_ = 0x3f800002;
    auStack_8d8 = auVar39._8_24_;
    fVar107 = local_460._0_4_;
    local_4e0._0_4_ = fVar107 * 4.0;
    fVar109 = local_460._4_4_;
    local_4e0._4_4_ = fVar109 * 4.0;
    fVar111 = local_460._8_4_;
    fStack_4d8 = fVar111 * 4.0;
    fVar112 = local_460._12_4_;
    fStack_4d4 = fVar112 * 4.0;
    fVar113 = local_460._16_4_;
    fStack_4d0 = fVar113 * 4.0;
    fVar114 = local_460._20_4_;
    fStack_4cc = fVar114 * 4.0;
    fVar309 = local_460._24_4_;
    fStack_4c8 = fVar309 * 4.0;
    uStack_4c4 = 0x40800000;
    auVar40._4_4_ = auVar219._4_4_ * (float)local_4e0._4_4_;
    auVar40._0_4_ = auVar219._0_4_ * (float)local_4e0._0_4_;
    auVar40._8_4_ = auVar219._8_4_ * fStack_4d8;
    auVar40._12_4_ = auVar219._12_4_ * fStack_4d4;
    auVar40._16_4_ = auVar219._16_4_ * fStack_4d0;
    auVar40._20_4_ = auVar219._20_4_ * fStack_4cc;
    auVar40._24_4_ = auVar219._24_4_ * fStack_4c8;
    auVar40._28_4_ = 0x40800000;
    auVar279 = vsubps_avx(auVar39,auVar40);
    auVar94 = vcmpps_avx(auVar279,ZEXT832(0) << 0x20,5);
    fVar159 = local_460._28_4_;
    if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar94 >> 0x7f,0) == '\0') &&
          (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar94 >> 0xbf,0) == '\0') &&
        (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar94[0x1f]) {
      auVar97._8_4_ = 0x7f800000;
      auVar97._0_8_ = 0x7f8000007f800000;
      auVar97._12_4_ = 0x7f800000;
      auVar97._16_4_ = 0x7f800000;
      auVar97._20_4_ = 0x7f800000;
      auVar97._24_4_ = 0x7f800000;
      auVar97._28_4_ = 0x7f800000;
      auVar358._8_4_ = 0xff800000;
      auVar358._0_8_ = 0xff800000ff800000;
      auVar358._12_4_ = 0xff800000;
      auVar358._16_4_ = 0xff800000;
      auVar358._20_4_ = 0xff800000;
      auVar358._24_4_ = 0xff800000;
      auVar358._28_4_ = 0xff800000;
    }
    else {
      local_580 = auVar94;
      auVar8 = vcmpps_avx(auVar279,ZEXT832(0) << 0x20,5);
      auVar23 = vsqrtps_avx(auVar279);
      auVar244._0_4_ = fVar107 + fVar107;
      auVar244._4_4_ = fVar109 + fVar109;
      auVar244._8_4_ = fVar111 + fVar111;
      auVar244._12_4_ = fVar112 + fVar112;
      auVar244._16_4_ = fVar113 + fVar113;
      auVar244._20_4_ = fVar114 + fVar114;
      auVar244._24_4_ = fVar309 + fVar309;
      auVar244._28_4_ = fVar159 + fVar159;
      auVar279 = vrcpps_avx(auVar244);
      fVar239 = auVar279._0_4_;
      fVar254 = auVar279._4_4_;
      auVar41._4_4_ = auVar244._4_4_ * fVar254;
      auVar41._0_4_ = auVar244._0_4_ * fVar239;
      fVar258 = auVar279._8_4_;
      auVar41._8_4_ = auVar244._8_4_ * fVar258;
      fVar262 = auVar279._12_4_;
      auVar41._12_4_ = auVar244._12_4_ * fVar262;
      fVar265 = auVar279._16_4_;
      auVar41._16_4_ = auVar244._16_4_ * fVar265;
      fVar268 = auVar279._20_4_;
      auVar41._20_4_ = auVar244._20_4_ * fVar268;
      fVar271 = auVar279._24_4_;
      auVar41._24_4_ = auVar244._24_4_ * fVar271;
      auVar41._28_4_ = auVar244._28_4_;
      auVar302._8_4_ = 0x3f800000;
      auVar302._0_8_ = 0x3f8000003f800000;
      auVar302._12_4_ = 0x3f800000;
      auVar302._16_4_ = 0x3f800000;
      auVar302._20_4_ = 0x3f800000;
      auVar302._24_4_ = 0x3f800000;
      auVar302._28_4_ = 0x3f800000;
      auVar279 = vsubps_avx(auVar302,auVar41);
      fVar239 = fVar239 + fVar239 * auVar279._0_4_;
      fVar254 = fVar254 + fVar254 * auVar279._4_4_;
      fVar258 = fVar258 + fVar258 * auVar279._8_4_;
      fVar262 = fVar262 + fVar262 * auVar279._12_4_;
      fVar265 = fVar265 + fVar265 * auVar279._16_4_;
      fVar268 = fVar268 + fVar268 * auVar279._20_4_;
      fVar271 = fVar271 + fVar271 * auVar279._24_4_;
      auVar278._0_8_ = CONCAT44(fVar318,fVar310) ^ 0x8000000080000000;
      auVar278._8_4_ = -local_900._8_4_;
      auVar278._12_4_ = -local_900._12_4_;
      auVar278._16_4_ = -local_900._16_4_;
      auVar278._20_4_ = -local_900._20_4_;
      auVar278._24_4_ = -local_900._24_4_;
      auVar278._28_4_ = -local_900._28_4_;
      auVar279 = vsubps_avx(auVar278,auVar23);
      fVar310 = auVar279._0_4_ * fVar239;
      fVar318 = auVar279._4_4_ * fVar254;
      auVar42._4_4_ = fVar318;
      auVar42._0_4_ = fVar310;
      fVar284 = auVar279._8_4_ * fVar258;
      auVar42._8_4_ = fVar284;
      fVar288 = auVar279._12_4_ * fVar262;
      auVar42._12_4_ = fVar288;
      fVar291 = auVar279._16_4_ * fVar265;
      auVar42._16_4_ = fVar291;
      fVar294 = auVar279._20_4_ * fVar268;
      auVar42._20_4_ = fVar294;
      fVar297 = auVar279._24_4_ * fVar271;
      auVar42._24_4_ = fVar297;
      auVar42._28_4_ = auVar279._28_4_;
      auVar279 = vsubps_avx(auVar23,local_900);
      fVar239 = auVar279._0_4_ * fVar239;
      fVar254 = auVar279._4_4_ * fVar254;
      auVar43._4_4_ = fVar254;
      auVar43._0_4_ = fVar239;
      fVar258 = auVar279._8_4_ * fVar258;
      auVar43._8_4_ = fVar258;
      fVar262 = auVar279._12_4_ * fVar262;
      auVar43._12_4_ = fVar262;
      fVar265 = auVar279._16_4_ * fVar265;
      auVar43._16_4_ = fVar265;
      fVar268 = auVar279._20_4_ * fVar268;
      auVar43._20_4_ = fVar268;
      fVar271 = auVar279._24_4_ * fVar271;
      auVar43._24_4_ = fVar271;
      auVar43._28_4_ = auVar279._28_4_;
      local_5a0 = local_340 * (fVar273 + local_480 * fVar310);
      fStack_59c = fStack_33c * (fVar281 + fStack_47c * fVar318);
      fStack_598 = fStack_338 * (fVar283 + fStack_478 * fVar284);
      fStack_594 = fStack_334 * (fVar287 + fStack_474 * fVar288);
      fStack_590 = fStack_330 * (fVar290 + fStack_470 * fVar291);
      fStack_58c = fStack_32c * (fVar293 + fStack_46c * fVar294);
      fStack_588 = fStack_328 * (fVar296 + fStack_468 * fVar297);
      fStack_584 = local_900._28_4_;
      auVar313._8_4_ = 0x7fffffff;
      auVar313._0_8_ = 0x7fffffff7fffffff;
      auVar313._12_4_ = 0x7fffffff;
      auVar313._16_4_ = 0x7fffffff;
      auVar313._20_4_ = 0x7fffffff;
      auVar313._24_4_ = 0x7fffffff;
      auVar313._28_4_ = 0x7fffffff;
      auVar279 = vandps_avx(local_360,auVar313);
      auVar279 = vmaxps_avx(local_440,auVar279);
      auVar44._4_4_ = auVar279._4_4_ * 1.9073486e-06;
      auVar44._0_4_ = auVar279._0_4_ * 1.9073486e-06;
      auVar44._8_4_ = auVar279._8_4_ * 1.9073486e-06;
      auVar44._12_4_ = auVar279._12_4_ * 1.9073486e-06;
      auVar44._16_4_ = auVar279._16_4_ * 1.9073486e-06;
      auVar44._20_4_ = auVar279._20_4_ * 1.9073486e-06;
      auVar44._24_4_ = auVar279._24_4_ * 1.9073486e-06;
      auVar44._28_4_ = auVar279._28_4_;
      auVar279 = vandps_avx(local_460,auVar313);
      auVar279 = vcmpps_avx(auVar279,auVar44,1);
      auVar314._8_4_ = 0x7f800000;
      auVar314._0_8_ = 0x7f8000007f800000;
      auVar314._12_4_ = 0x7f800000;
      auVar314._16_4_ = 0x7f800000;
      auVar314._20_4_ = 0x7f800000;
      auVar314._24_4_ = 0x7f800000;
      auVar314._28_4_ = 0x7f800000;
      auVar97 = vblendvps_avx(auVar314,auVar42,auVar8);
      local_5e0._4_4_ = fStack_33c * (fVar281 + fStack_47c * fVar254);
      local_5e0._0_4_ = local_340 * (fVar273 + local_480 * fVar239);
      fStack_5d8 = fStack_338 * (fVar283 + fStack_478 * fVar258);
      fStack_5d4 = fStack_334 * (fVar287 + fStack_474 * fVar262);
      fStack_5d0 = fStack_330 * (fVar290 + fStack_470 * fVar265);
      fStack_5cc = fStack_32c * (fVar293 + fStack_46c * fVar268);
      fStack_5c8 = fStack_328 * (fVar296 + fStack_468 * fVar271);
      uStack_5c4 = auVar97._28_4_;
      auVar245._8_4_ = 0xff800000;
      auVar245._0_8_ = 0xff800000ff800000;
      auVar245._12_4_ = 0xff800000;
      auVar245._16_4_ = 0xff800000;
      auVar245._20_4_ = 0xff800000;
      auVar245._24_4_ = 0xff800000;
      auVar245._28_4_ = 0xff800000;
      auVar358 = vblendvps_avx(auVar245,auVar43,auVar8);
      auVar23 = auVar8 & auVar279;
      if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar23 >> 0x7f,0) != '\0') ||
            (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar23 >> 0xbf,0) != '\0') ||
          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar23[0x1f] < '\0') {
        auVar94 = vandps_avx(auVar279,auVar8);
        auVar81 = vpackssdw_avx(auVar94._0_16_,auVar94._16_16_);
        auVar279 = vcmpps_avx(auVar219,ZEXT832(0) << 0x20,2);
        auVar362._8_4_ = 0xff800000;
        auVar362._0_8_ = 0xff800000ff800000;
        auVar362._12_4_ = 0xff800000;
        auVar362._16_4_ = 0xff800000;
        auVar362._20_4_ = 0xff800000;
        auVar362._24_4_ = 0xff800000;
        auVar362._28_4_ = 0xff800000;
        auVar347._8_4_ = 0x7f800000;
        auVar347._0_8_ = 0x7f8000007f800000;
        auVar347._12_4_ = 0x7f800000;
        auVar347._16_4_ = 0x7f800000;
        auVar347._20_4_ = 0x7f800000;
        auVar347._24_4_ = 0x7f800000;
        auVar347._28_4_ = 0x7f800000;
        auVar219 = vblendvps_avx(auVar347,auVar362,auVar279);
        auVar118 = vpmovsxwd_avx(auVar81);
        auVar81 = vpunpckhwd_avx(auVar81,auVar81);
        auVar226._16_16_ = auVar81;
        auVar226._0_16_ = auVar118;
        auVar97 = vblendvps_avx(auVar97,auVar219,auVar226);
        auVar219 = vblendvps_avx(auVar362,auVar347,auVar279);
        auVar358 = vblendvps_avx(auVar358,auVar219,auVar226);
        auVar219 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar104._0_4_ = auVar94._0_4_ ^ auVar219._0_4_;
        auVar104._4_4_ = auVar94._4_4_ ^ auVar219._4_4_;
        auVar104._8_4_ = auVar94._8_4_ ^ auVar219._8_4_;
        auVar104._12_4_ = auVar94._12_4_ ^ auVar219._12_4_;
        auVar104._16_4_ = auVar94._16_4_ ^ auVar219._16_4_;
        auVar104._20_4_ = auVar94._20_4_ ^ auVar219._20_4_;
        auVar104._24_4_ = auVar94._24_4_ ^ auVar219._24_4_;
        auVar104._28_4_ = auVar94._28_4_ ^ auVar219._28_4_;
        auVar94 = vorps_avx(auVar279,auVar104);
        auVar94 = vandps_avx(auVar8,auVar94);
      }
    }
    auVar219 = local_400 & auVar94;
    if ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar219 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar219 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar219 >> 0x7f,0) == '\0') &&
          (auVar219 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar219 >> 0xbf,0) == '\0') &&
        (auVar219 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar219[0x1f])
    {
LAB_00ea3a15:
      auVar322 = ZEXT3264(local_9a0);
      auVar250 = ZEXT3264(local_9c0);
      auVar303 = ZEXT3264(local_9e0);
    }
    else {
      fStack_464 = fStack_724 + fStack_744 + 0.0;
      fStack_324 = auVar95._28_4_ + auVar150._28_4_;
      auVar118 = ZEXT416((uint)*(float *)(ray + k * 4 + 0x80));
      local_580._0_16_ = auVar118;
      auVar81 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_810._0_4_));
      auVar81 = vshufps_avx(auVar81,auVar81,0);
      auVar221._16_16_ = auVar81;
      auVar221._0_16_ = auVar81;
      auVar279 = vminps_avx(auVar221,auVar358);
      fVar268 = auVar25._28_4_;
      auVar132._0_4_ =
           (float)local_740._0_4_ * fVar238 +
           (float)local_760._0_4_ * fVar272 + fVar330 * (float)local_720._0_4_;
      auVar132._4_4_ =
           (float)local_740._4_4_ * fVar253 +
           (float)local_760._4_4_ * fVar280 + fVar332 * (float)local_720._4_4_;
      auVar132._8_4_ = fStack_738 * fVar257 + fStack_758 * fVar282 + fVar333 * fStack_718;
      auVar132._12_4_ = fStack_734 * fVar261 + fStack_754 * fVar286 + fVar334 * fStack_714;
      auVar132._16_4_ = fStack_730 * fVar264 + fStack_750 * fVar289 + fVar335 * fStack_710;
      auVar132._20_4_ = fStack_72c * fVar267 + fStack_74c * fVar292 + fVar336 * fStack_70c;
      auVar132._24_4_ = fStack_728 * fVar270 + fStack_748 * fVar295 + fVar337 * fStack_708;
      auVar132._28_4_ = fVar268 + auVar277._28_4_ + fVar268;
      auVar219 = vrcpps_avx(auVar132);
      fVar310 = auVar219._0_4_;
      fVar318 = auVar219._4_4_;
      auVar45._4_4_ = auVar132._4_4_ * fVar318;
      auVar45._0_4_ = auVar132._0_4_ * fVar310;
      fVar239 = auVar219._8_4_;
      auVar45._8_4_ = auVar132._8_4_ * fVar239;
      fVar254 = auVar219._12_4_;
      auVar45._12_4_ = auVar132._12_4_ * fVar254;
      fVar258 = auVar219._16_4_;
      auVar45._16_4_ = auVar132._16_4_ * fVar258;
      fVar262 = auVar219._20_4_;
      auVar45._20_4_ = auVar132._20_4_ * fVar262;
      fVar265 = auVar219._24_4_;
      auVar45._24_4_ = auVar132._24_4_ * fVar265;
      auVar45._28_4_ = auVar26._28_4_;
      auVar345._8_4_ = 0x3f800000;
      auVar345._0_8_ = 0x3f8000003f800000;
      auVar345._12_4_ = 0x3f800000;
      auVar345._16_4_ = 0x3f800000;
      auVar345._20_4_ = 0x3f800000;
      auVar345._24_4_ = 0x3f800000;
      auVar345._28_4_ = 0x3f800000;
      auVar25 = vsubps_avx(auVar345,auVar45);
      auVar308._8_4_ = 0x7fffffff;
      auVar308._0_8_ = 0x7fffffff7fffffff;
      auVar308._12_4_ = 0x7fffffff;
      auVar308._16_4_ = 0x7fffffff;
      auVar308._20_4_ = 0x7fffffff;
      auVar308._24_4_ = 0x7fffffff;
      auVar308._28_4_ = 0x7fffffff;
      auVar219 = vandps_avx(auVar308,auVar132);
      auVar346._8_4_ = 0x219392ef;
      auVar346._0_8_ = 0x219392ef219392ef;
      auVar346._12_4_ = 0x219392ef;
      auVar346._16_4_ = 0x219392ef;
      auVar346._20_4_ = 0x219392ef;
      auVar346._24_4_ = 0x219392ef;
      auVar346._28_4_ = 0x219392ef;
      auVar95 = vcmpps_avx(auVar219,auVar346,1);
      auVar46._4_4_ =
           (fVar318 + fVar318 * auVar25._4_4_) *
           -(fVar185 * fVar253 + fVar184 * fVar280 + fVar183 * fVar332);
      auVar46._0_4_ =
           (fVar310 + fVar310 * auVar25._0_4_) *
           -(fVar236 * fVar238 + fVar181 * fVar272 + fVar231 * fVar330);
      auVar46._8_4_ =
           (fVar239 + fVar239 * auVar25._8_4_) *
           -(fVar208 * fVar257 + fVar207 * fVar282 + fVar206 * fVar333);
      auVar46._12_4_ =
           (fVar254 + fVar254 * auVar25._12_4_) *
           -(fVar234 * fVar261 + fVar233 * fVar286 + fVar232 * fVar334);
      auVar46._16_4_ =
           (fVar258 + fVar258 * auVar25._16_4_) *
           -(fVar266 * fVar264 + fVar263 * fVar289 + fVar260 * fVar335);
      auVar46._20_4_ =
           (fVar262 + fVar262 * auVar25._20_4_) *
           -(fVar11 * fVar267 + fVar355 * fVar292 + fVar338 * fVar336);
      auVar46._24_4_ =
           (fVar265 + fVar265 * auVar25._24_4_) *
           -(fVar18 * fVar270 + fVar17 * fVar295 + fVar16 * fVar337);
      auVar46._28_4_ = -(fVar268 + auVar24._28_4_ + fVar268);
      auVar219 = vcmpps_avx(auVar132,ZEXT832(0) << 0x20,1);
      auVar219 = vorps_avx(auVar95,auVar219);
      auVar321._8_4_ = 0xff800000;
      auVar321._0_8_ = 0xff800000ff800000;
      auVar321._12_4_ = 0xff800000;
      auVar321._16_4_ = 0xff800000;
      auVar321._20_4_ = 0xff800000;
      auVar321._24_4_ = 0xff800000;
      auVar321._28_4_ = 0xff800000;
      auVar219 = vblendvps_avx(auVar46,auVar321,auVar219);
      auVar24 = vcmpps_avx(auVar132,ZEXT832(0) << 0x20,6);
      auVar95 = vorps_avx(auVar95,auVar24);
      auVar359._8_4_ = 0x7f800000;
      auVar359._0_8_ = 0x7f8000007f800000;
      auVar359._12_4_ = 0x7f800000;
      auVar359._16_4_ = 0x7f800000;
      auVar359._20_4_ = 0x7f800000;
      auVar359._24_4_ = 0x7f800000;
      auVar359._28_4_ = 0x7f800000;
      auVar95 = vblendvps_avx(auVar46,auVar359,auVar95);
      auVar24 = vmaxps_avx(local_320,auVar97);
      auVar24 = vmaxps_avx(auVar24,auVar219);
      auVar25 = vminps_avx(auVar279,auVar95);
      auVar279 = ZEXT832(0) << 0x20;
      auVar219 = vsubps_avx(auVar279,auVar131);
      auVar95 = vsubps_avx(auVar279,local_a00);
      auVar47._4_4_ = auVar95._4_4_ * -fVar349;
      auVar47._0_4_ = auVar95._0_4_ * -fVar339;
      auVar47._8_4_ = auVar95._8_4_ * -fVar350;
      auVar47._12_4_ = auVar95._12_4_ * -fVar351;
      auVar47._16_4_ = auVar95._16_4_ * -fVar352;
      auVar47._20_4_ = auVar95._20_4_ * -fVar353;
      auVar47._24_4_ = auVar95._24_4_ * -fVar354;
      auVar47._28_4_ = auVar95._28_4_;
      auVar48._4_4_ = fVar259 * auVar219._4_4_;
      auVar48._0_4_ = fVar229 * auVar219._0_4_;
      auVar48._8_4_ = fVar204 * auVar219._8_4_;
      auVar48._12_4_ = fVar228 * auVar219._12_4_;
      auVar48._16_4_ = fVar252 * auVar219._16_4_;
      auVar48._20_4_ = fVar304 * auVar219._20_4_;
      auVar48._24_4_ = fVar14 * auVar219._24_4_;
      auVar48._28_4_ = auVar219._28_4_;
      auVar219 = vsubps_avx(auVar47,auVar48);
      auVar95 = vsubps_avx(auVar279,auVar22);
      auVar49._4_4_ = fVar182 * auVar95._4_4_;
      auVar49._0_4_ = fVar180 * auVar95._0_4_;
      auVar49._8_4_ = fVar205 * auVar95._8_4_;
      auVar49._12_4_ = fVar230 * auVar95._12_4_;
      auVar49._16_4_ = fVar256 * auVar95._16_4_;
      auVar49._20_4_ = fVar329 * auVar95._20_4_;
      uVar1 = auVar95._28_4_;
      auVar49._24_4_ = fVar15 * auVar95._24_4_;
      auVar49._28_4_ = uVar1;
      auVar131 = vsubps_avx(auVar219,auVar49);
      auVar50._4_4_ = -fVar349 * (float)local_720._4_4_;
      auVar50._0_4_ = -fVar339 * (float)local_720._0_4_;
      auVar50._8_4_ = -fVar350 * fStack_718;
      auVar50._12_4_ = -fVar351 * fStack_714;
      auVar50._16_4_ = -fVar352 * fStack_710;
      auVar50._20_4_ = -fVar353 * fStack_70c;
      auVar50._24_4_ = -fVar354 * fStack_708;
      auVar50._28_4_ = uVar73 ^ 0x80000000;
      auVar51._4_4_ = (float)local_760._4_4_ * fVar259;
      auVar51._0_4_ = (float)local_760._0_4_ * fVar229;
      auVar51._8_4_ = fStack_758 * fVar204;
      auVar51._12_4_ = fStack_754 * fVar228;
      auVar51._16_4_ = fStack_750 * fVar252;
      auVar51._20_4_ = fStack_74c * fVar304;
      auVar51._24_4_ = fStack_748 * fVar14;
      auVar51._28_4_ = uVar1;
      auVar315._8_4_ = 0x3f800000;
      auVar315._0_8_ = 0x3f8000003f800000;
      auVar315._12_4_ = 0x3f800000;
      auVar315._16_4_ = 0x3f800000;
      auVar315._20_4_ = 0x3f800000;
      auVar315._24_4_ = 0x3f800000;
      auVar315._28_4_ = 0x3f800000;
      auVar219 = vsubps_avx(auVar50,auVar51);
      auVar52._4_4_ = (float)local_740._4_4_ * fVar182;
      auVar52._0_4_ = (float)local_740._0_4_ * fVar180;
      auVar52._8_4_ = fStack_738 * fVar205;
      auVar52._12_4_ = fStack_734 * fVar230;
      auVar52._16_4_ = fStack_730 * fVar256;
      auVar52._20_4_ = fStack_72c * fVar329;
      auVar52._24_4_ = fStack_728 * fVar15;
      auVar52._28_4_ = uVar1;
      auVar22 = vsubps_avx(auVar219,auVar52);
      auVar219 = vrcpps_avx(auVar22);
      fVar229 = auVar219._0_4_;
      fVar180 = auVar219._4_4_;
      auVar53._4_4_ = auVar22._4_4_ * fVar180;
      auVar53._0_4_ = auVar22._0_4_ * fVar229;
      fVar231 = auVar219._8_4_;
      auVar53._8_4_ = auVar22._8_4_ * fVar231;
      fVar181 = auVar219._12_4_;
      auVar53._12_4_ = auVar22._12_4_ * fVar181;
      fVar236 = auVar219._16_4_;
      auVar53._16_4_ = auVar22._16_4_ * fVar236;
      fVar259 = auVar219._20_4_;
      auVar53._20_4_ = auVar22._20_4_ * fVar259;
      fVar182 = auVar219._24_4_;
      auVar53._24_4_ = auVar22._24_4_ * fVar182;
      auVar53._28_4_ = fStack_724;
      auVar26 = vsubps_avx(auVar315,auVar53);
      auVar219 = vandps_avx(auVar308,auVar22);
      auVar95 = vcmpps_avx(auVar219,auVar346,1);
      auVar54._4_4_ = (fVar180 + fVar180 * auVar26._4_4_) * -auVar131._4_4_;
      auVar54._0_4_ = (fVar229 + fVar229 * auVar26._0_4_) * -auVar131._0_4_;
      auVar54._8_4_ = (fVar231 + fVar231 * auVar26._8_4_) * -auVar131._8_4_;
      auVar54._12_4_ = (fVar181 + fVar181 * auVar26._12_4_) * -auVar131._12_4_;
      auVar54._16_4_ = (fVar236 + fVar236 * auVar26._16_4_) * -auVar131._16_4_;
      auVar54._20_4_ = (fVar259 + fVar259 * auVar26._20_4_) * -auVar131._20_4_;
      auVar54._24_4_ = (fVar182 + fVar182 * auVar26._24_4_) * -auVar131._24_4_;
      auVar54._28_4_ = auVar131._28_4_ ^ 0x80000000;
      auVar219 = vcmpps_avx(auVar22,auVar279,1);
      auVar219 = vorps_avx(auVar95,auVar219);
      auVar219 = vblendvps_avx(auVar54,auVar321,auVar219);
      _local_7e0 = vmaxps_avx(auVar24,auVar219);
      auVar219 = vcmpps_avx(auVar22,ZEXT832(0) << 0x20,6);
      auVar219 = vorps_avx(auVar95,auVar219);
      auVar219 = vblendvps_avx(auVar54,auVar359,auVar219);
      auVar94 = vandps_avx(auVar94,local_400);
      local_380 = vminps_avx(auVar25,auVar219);
      auVar219 = vcmpps_avx(_local_7e0,local_380,2);
      auVar95 = auVar94 & auVar219;
      if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar95 >> 0x7f,0) == '\0') &&
            (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar95 >> 0xbf,0) == '\0') &&
          (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar95[0x1f])
      goto LAB_00ea3a15;
      auVar95 = vminps_avx(local_700,auVar96);
      auVar131 = vminps_avx(auVar151,auVar348);
      auVar95 = vminps_avx(auVar95,auVar131);
      auVar95 = vsubps_avx(auVar95,local_500);
      auVar94 = vandps_avx(auVar219,auVar94);
      auVar68._4_4_ = fStack_59c;
      auVar68._0_4_ = local_5a0;
      auVar68._8_4_ = fStack_598;
      auVar68._12_4_ = fStack_594;
      auVar68._16_4_ = fStack_590;
      auVar68._20_4_ = fStack_58c;
      auVar68._24_4_ = fStack_588;
      auVar68._28_4_ = fStack_584;
      auVar219 = vminps_avx(auVar68,auVar315);
      auVar219 = vmaxps_avx(auVar219,ZEXT832(0) << 0x20);
      local_1a0[0] = fVar79 + fVar115 * (auVar219._0_4_ + 0.0) * 0.125;
      local_1a0[1] = fVar106 + fVar140 * (auVar219._4_4_ + 1.0) * 0.125;
      local_1a0[2] = fVar108 + fVar141 * (auVar219._8_4_ + 2.0) * 0.125;
      local_1a0[3] = fVar110 + fVar142 * (auVar219._12_4_ + 3.0) * 0.125;
      fStack_190 = fVar79 + fVar115 * (auVar219._16_4_ + 4.0) * 0.125;
      fStack_18c = fVar106 + fVar140 * (auVar219._20_4_ + 5.0) * 0.125;
      fStack_188 = fVar108 + fVar141 * (auVar219._24_4_ + 6.0) * 0.125;
      fStack_184 = fVar110 + auVar219._28_4_ + 7.0;
      auVar219 = vminps_avx(_local_5e0,auVar315);
      auVar219 = vmaxps_avx(auVar219,ZEXT832(0) << 0x20);
      local_1c0[0] = fVar79 + fVar115 * (auVar219._0_4_ + 0.0) * 0.125;
      local_1c0[1] = fVar106 + fVar140 * (auVar219._4_4_ + 1.0) * 0.125;
      local_1c0[2] = fVar108 + fVar141 * (auVar219._8_4_ + 2.0) * 0.125;
      local_1c0[3] = fVar110 + fVar142 * (auVar219._12_4_ + 3.0) * 0.125;
      fStack_1b0 = fVar79 + fVar115 * (auVar219._16_4_ + 4.0) * 0.125;
      fStack_1ac = fVar106 + fVar140 * (auVar219._20_4_ + 5.0) * 0.125;
      fStack_1a8 = fVar108 + fVar141 * (auVar219._24_4_ + 6.0) * 0.125;
      fStack_1a4 = fVar110 + auVar219._28_4_ + 7.0;
      auVar55._4_4_ = auVar95._4_4_ * 0.99999976;
      auVar55._0_4_ = auVar95._0_4_ * 0.99999976;
      auVar55._8_4_ = auVar95._8_4_ * 0.99999976;
      auVar55._12_4_ = auVar95._12_4_ * 0.99999976;
      auVar55._16_4_ = auVar95._16_4_ * 0.99999976;
      auVar55._20_4_ = auVar95._20_4_ * 0.99999976;
      auVar55._24_4_ = auVar95._24_4_ * 0.99999976;
      auVar55._28_4_ = 0x3f7ffffc;
      auVar219 = vmaxps_avx(ZEXT832(0) << 0x20,auVar55);
      auVar56._4_4_ = auVar219._4_4_ * auVar219._4_4_;
      auVar56._0_4_ = auVar219._0_4_ * auVar219._0_4_;
      auVar56._8_4_ = auVar219._8_4_ * auVar219._8_4_;
      auVar56._12_4_ = auVar219._12_4_ * auVar219._12_4_;
      auVar56._16_4_ = auVar219._16_4_ * auVar219._16_4_;
      auVar56._20_4_ = auVar219._20_4_ * auVar219._20_4_;
      auVar56._24_4_ = auVar219._24_4_ * auVar219._24_4_;
      auVar56._28_4_ = auVar219._28_4_;
      local_860 = vsubps_avx(auVar27,auVar56);
      auVar57._4_4_ = local_860._4_4_ * (float)local_4e0._4_4_;
      auVar57._0_4_ = local_860._0_4_ * (float)local_4e0._0_4_;
      auVar57._8_4_ = local_860._8_4_ * fStack_4d8;
      auVar57._12_4_ = local_860._12_4_ * fStack_4d4;
      auVar57._16_4_ = local_860._16_4_ * fStack_4d0;
      auVar57._20_4_ = local_860._20_4_ * fStack_4cc;
      auVar57._24_4_ = local_860._24_4_ * fStack_4c8;
      auVar57._28_4_ = auVar219._28_4_;
      auVar95 = vsubps_avx(auVar39,auVar57);
      auVar219 = vcmpps_avx(auVar95,ZEXT832(0) << 0x20,5);
      if ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar219 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar219 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar219 >> 0x7f,0) == '\0') &&
            (auVar219 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar219 >> 0xbf,0) == '\0') &&
          (auVar219 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar219[0x1f]) {
        auVar151 = SUB6432(ZEXT864(0),0) << 0x20;
        _local_7a0 = ZEXT832(0) << 0x20;
        _local_7c0 = ZEXT832(0) << 0x20;
        auVar174 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar197 = ZEXT1628(ZEXT816(0) << 0x40);
        auVar222._8_4_ = 0x7f800000;
        auVar222._0_8_ = 0x7f8000007f800000;
        auVar222._12_4_ = 0x7f800000;
        auVar222._16_4_ = 0x7f800000;
        auVar222._20_4_ = 0x7f800000;
        auVar222._24_4_ = 0x7f800000;
        auVar222._28_4_ = 0x7f800000;
        auVar246._8_4_ = 0xff800000;
        auVar246._0_8_ = 0xff800000ff800000;
        auVar246._12_4_ = 0xff800000;
        auVar246._16_4_ = 0xff800000;
        auVar246._20_4_ = 0xff800000;
        auVar246._24_4_ = 0xff800000;
        auVar246._28_4_ = 0xff800000;
        local_860 = auVar28;
        _local_780 = _local_7a0;
      }
      else {
        auVar151 = vsqrtps_avx(auVar95);
        auVar176._0_4_ = fVar107 + fVar107;
        auVar176._4_4_ = fVar109 + fVar109;
        auVar176._8_4_ = fVar111 + fVar111;
        auVar176._12_4_ = fVar112 + fVar112;
        auVar176._16_4_ = fVar113 + fVar113;
        auVar176._20_4_ = fVar114 + fVar114;
        auVar176._24_4_ = fVar309 + fVar309;
        auVar176._28_4_ = fVar159 + fVar159;
        auVar131 = vrcpps_avx(auVar176);
        fVar159 = auVar131._0_4_;
        fVar229 = auVar131._4_4_;
        auVar58._4_4_ = auVar176._4_4_ * fVar229;
        auVar58._0_4_ = auVar176._0_4_ * fVar159;
        fVar180 = auVar131._8_4_;
        auVar58._8_4_ = auVar176._8_4_ * fVar180;
        fVar231 = auVar131._12_4_;
        auVar58._12_4_ = auVar176._12_4_ * fVar231;
        fVar181 = auVar131._16_4_;
        auVar58._16_4_ = auVar176._16_4_ * fVar181;
        fVar236 = auVar131._20_4_;
        auVar58._20_4_ = auVar176._20_4_ * fVar236;
        fVar259 = auVar131._24_4_;
        auVar58._24_4_ = auVar176._24_4_ * fVar259;
        auVar58._28_4_ = auVar176._28_4_;
        auVar22 = vsubps_avx(auVar315,auVar58);
        fVar159 = fVar159 + fVar159 * auVar22._0_4_;
        fVar229 = fVar229 + fVar229 * auVar22._4_4_;
        fVar180 = fVar180 + fVar180 * auVar22._8_4_;
        fVar231 = fVar231 + fVar231 * auVar22._12_4_;
        fVar181 = fVar181 + fVar181 * auVar22._16_4_;
        fVar236 = fVar236 + fVar236 * auVar22._20_4_;
        fVar259 = fVar259 + fVar259 * auVar22._24_4_;
        fVar182 = auVar131._28_4_ + auVar22._28_4_;
        auVar200._0_8_ = local_900._0_8_ ^ 0x8000000080000000;
        auVar200._8_4_ = -local_900._8_4_;
        auVar200._12_4_ = -local_900._12_4_;
        auVar200._16_4_ = -local_900._16_4_;
        auVar200._20_4_ = -local_900._20_4_;
        auVar200._24_4_ = -local_900._24_4_;
        auVar200._28_4_ = -local_900._28_4_;
        auVar131 = vsubps_avx(auVar200,auVar151);
        fVar208 = auVar131._0_4_ * fVar159;
        fVar228 = auVar131._4_4_ * fVar229;
        auVar59._4_4_ = fVar228;
        auVar59._0_4_ = fVar208;
        fVar230 = auVar131._8_4_ * fVar180;
        auVar59._8_4_ = fVar230;
        fVar232 = auVar131._12_4_ * fVar231;
        auVar59._12_4_ = fVar232;
        fVar233 = auVar131._16_4_ * fVar181;
        auVar59._16_4_ = fVar233;
        fVar234 = auVar131._20_4_ * fVar236;
        auVar59._20_4_ = fVar234;
        fVar252 = auVar131._24_4_ * fVar259;
        auVar59._24_4_ = fVar252;
        auVar59._28_4_ = auVar19._12_4_;
        auVar151 = vsubps_avx(auVar151,local_900);
        fVar159 = auVar151._0_4_ * fVar159;
        fVar229 = auVar151._4_4_ * fVar229;
        auVar60._4_4_ = fVar229;
        auVar60._0_4_ = fVar159;
        fVar180 = auVar151._8_4_ * fVar180;
        auVar60._8_4_ = fVar180;
        fVar231 = auVar151._12_4_ * fVar231;
        auVar60._12_4_ = fVar231;
        fVar181 = auVar151._16_4_ * fVar181;
        auVar60._16_4_ = fVar181;
        fVar236 = auVar151._20_4_ * fVar236;
        auVar60._20_4_ = fVar236;
        fVar259 = auVar151._24_4_ * fVar259;
        auVar60._24_4_ = fVar259;
        auVar60._28_4_ = auVar10._12_4_;
        fVar183 = local_340 * (fVar208 * local_480 + fVar273);
        fVar184 = fStack_33c * (fVar228 * fStack_47c + fVar281);
        fVar185 = fStack_338 * (fVar230 * fStack_478 + fVar283);
        fVar204 = fStack_334 * (fVar232 * fStack_474 + fVar287);
        fVar205 = fStack_330 * (fVar233 * fStack_470 + fVar290);
        fVar206 = fStack_32c * (fVar234 * fStack_46c + fVar293);
        fVar207 = fStack_328 * (fVar252 * fStack_468 + fVar296);
        auVar152._0_4_ = auVar342._0_4_ + fVar179 * fVar183;
        auVar152._4_4_ = auVar342._4_4_ + fVar255 * fVar184;
        auVar152._8_4_ = auVar342._8_4_ + fVar187 * fVar185;
        auVar152._12_4_ = auVar342._12_4_ + fVar211 * fVar204;
        auVar152._16_4_ = auVar342._16_4_ + fVar237 * fVar205;
        auVar152._20_4_ = auVar342._20_4_ + fVar285 * fVar206;
        auVar152._24_4_ = auVar342._24_4_ + fVar13 * fVar207;
        auVar152._28_4_ = auVar342._28_4_ + auVar151._28_4_ + fVar298;
        auVar61._4_4_ = fVar228 * (float)local_740._4_4_;
        auVar61._0_4_ = fVar208 * (float)local_740._0_4_;
        auVar61._8_4_ = fVar230 * fStack_738;
        auVar61._12_4_ = fVar232 * fStack_734;
        auVar61._16_4_ = fVar233 * fStack_730;
        auVar61._20_4_ = fVar234 * fStack_72c;
        auVar61._24_4_ = fVar252 * fStack_728;
        auVar61._28_4_ = fVar182;
        auVar151 = vsubps_avx(auVar61,auVar152);
        auVar177._0_4_ = auVar356._0_4_ + fVar227 * fVar183;
        auVar177._4_4_ = auVar356._4_4_ + fVar251 * fVar184;
        auVar177._8_4_ = auVar356._8_4_ + fVar186 * fVar185;
        auVar177._12_4_ = auVar356._12_4_ + fVar209 * fVar204;
        auVar177._16_4_ = auVar356._16_4_ + fVar235 * fVar205;
        auVar177._20_4_ = auVar356._20_4_ + fVar269 * fVar206;
        auVar177._24_4_ = auVar356._24_4_ + fVar12 * fVar207;
        auVar177._28_4_ = auVar356._28_4_ + fVar182;
        auVar223._0_4_ = (float)local_760._0_4_ * fVar208;
        auVar223._4_4_ = (float)local_760._4_4_ * fVar228;
        auVar223._8_4_ = fStack_758 * fVar230;
        auVar223._12_4_ = fStack_754 * fVar232;
        auVar223._16_4_ = fStack_750 * fVar233;
        auVar223._20_4_ = fStack_74c * fVar234;
        auVar223._24_4_ = fStack_748 * fVar252;
        auVar223._28_4_ = 0;
        _local_960 = vsubps_avx(auVar223,auVar177);
        auVar201._0_4_ = (float)local_5c0._0_4_ + fVar319 * fVar183;
        auVar201._4_4_ = (float)local_5c0._4_4_ + fVar323 * fVar184;
        auVar201._8_4_ = fStack_5b8 + fVar324 * fVar185;
        auVar201._12_4_ = fStack_5b4 + fVar325 * fVar204;
        auVar201._16_4_ = fStack_5b0 + fVar326 * fVar205;
        auVar201._20_4_ = fStack_5ac + fVar327 * fVar206;
        auVar201._24_4_ = fStack_5a8 + fVar328 * fVar207;
        auVar201._28_4_ = fStack_5a4 + auVar131._28_4_;
        auVar62._4_4_ = (float)local_720._4_4_ * fVar228;
        auVar62._0_4_ = (float)local_720._0_4_ * fVar208;
        auVar62._8_4_ = fStack_718 * fVar230;
        auVar62._12_4_ = fStack_714 * fVar232;
        auVar62._16_4_ = fStack_710 * fVar233;
        auVar62._20_4_ = fStack_70c * fVar234;
        auVar62._24_4_ = fStack_708 * fVar252;
        auVar62._28_4_ = 0;
        auVar131 = vsubps_avx(auVar62,auVar201);
        auVar197 = auVar131._0_28_;
        fVar182 = local_340 * (fVar159 * local_480 + fVar273);
        fVar183 = fStack_33c * (fVar229 * fStack_47c + fVar281);
        fVar184 = fStack_338 * (fVar180 * fStack_478 + fVar283);
        fVar185 = fStack_334 * (fVar231 * fStack_474 + fVar287);
        fVar204 = fStack_330 * (fVar181 * fStack_470 + fVar290);
        fVar205 = fStack_32c * (fVar236 * fStack_46c + fVar293);
        fVar206 = fStack_328 * (fVar259 * fStack_468 + fVar296);
        auVar247._0_4_ = auVar342._0_4_ + fVar179 * fVar182;
        auVar247._4_4_ = auVar342._4_4_ + fVar255 * fVar183;
        auVar247._8_4_ = auVar342._8_4_ + fVar187 * fVar184;
        auVar247._12_4_ = auVar342._12_4_ + fVar211 * fVar185;
        auVar247._16_4_ = auVar342._16_4_ + fVar237 * fVar204;
        auVar247._20_4_ = auVar342._20_4_ + fVar285 * fVar205;
        auVar247._24_4_ = auVar342._24_4_ + fVar13 * fVar206;
        auVar247._28_4_ = auVar342._28_4_ + (float)local_560._28_4_;
        auVar63._4_4_ = fVar229 * (float)local_740._4_4_;
        auVar63._0_4_ = fVar159 * (float)local_740._0_4_;
        auVar63._8_4_ = fVar180 * fStack_738;
        auVar63._12_4_ = fVar231 * fStack_734;
        auVar63._16_4_ = fVar181 * fStack_730;
        auVar63._20_4_ = fVar236 * fStack_72c;
        auVar63._24_4_ = fVar259 * fStack_728;
        auVar63._28_4_ = fStack_724;
        _local_780 = vsubps_avx(auVar63,auVar247);
        auVar248._0_4_ = auVar356._0_4_ + fVar227 * fVar182;
        auVar248._4_4_ = auVar356._4_4_ + fVar251 * fVar183;
        auVar248._8_4_ = auVar356._8_4_ + fVar186 * fVar184;
        auVar248._12_4_ = auVar356._12_4_ + fVar209 * fVar185;
        auVar248._16_4_ = auVar356._16_4_ + fVar235 * fVar204;
        auVar248._20_4_ = auVar356._20_4_ + fVar269 * fVar205;
        auVar248._24_4_ = auVar356._24_4_ + fVar12 * fVar206;
        auVar248._28_4_ = auVar356._28_4_ + local_780._28_4_;
        auVar64._4_4_ = (float)local_760._4_4_ * fVar229;
        auVar64._0_4_ = (float)local_760._0_4_ * fVar159;
        auVar64._8_4_ = fStack_758 * fVar180;
        auVar64._12_4_ = fStack_754 * fVar231;
        auVar64._16_4_ = fStack_750 * fVar181;
        auVar64._20_4_ = fStack_74c * fVar236;
        auVar64._24_4_ = fStack_748 * fVar259;
        auVar64._28_4_ = fStack_724;
        _local_7a0 = vsubps_avx(auVar64,auVar248);
        auVar224._0_4_ = (float)local_5c0._0_4_ + fVar319 * fVar182;
        auVar224._4_4_ = (float)local_5c0._4_4_ + fVar323 * fVar183;
        auVar224._8_4_ = fStack_5b8 + fVar324 * fVar184;
        auVar224._12_4_ = fStack_5b4 + fVar325 * fVar185;
        auVar224._16_4_ = fStack_5b0 + fVar326 * fVar204;
        auVar224._20_4_ = fStack_5ac + fVar327 * fVar205;
        auVar224._24_4_ = fStack_5a8 + fVar328 * fVar206;
        auVar224._28_4_ = fStack_5a4 + fVar298 + 0.0;
        auVar65._4_4_ = (float)local_720._4_4_ * fVar229;
        auVar65._0_4_ = (float)local_720._0_4_ * fVar159;
        auVar65._8_4_ = fStack_718 * fVar180;
        auVar65._12_4_ = fStack_714 * fVar231;
        auVar65._16_4_ = fStack_710 * fVar181;
        auVar65._20_4_ = fStack_70c * fVar236;
        auVar65._24_4_ = fStack_708 * fVar259;
        auVar65._28_4_ = local_7a0._28_4_;
        _local_7c0 = vsubps_avx(auVar65,auVar224);
        auVar131 = vcmpps_avx(auVar95,_DAT_01faff00,5);
        auVar225._8_4_ = 0x7f800000;
        auVar225._0_8_ = 0x7f8000007f800000;
        auVar225._12_4_ = 0x7f800000;
        auVar225._16_4_ = 0x7f800000;
        auVar225._20_4_ = 0x7f800000;
        auVar225._24_4_ = 0x7f800000;
        auVar225._28_4_ = 0x7f800000;
        auVar222 = vblendvps_avx(auVar225,auVar59,auVar131);
        auVar316._8_4_ = 0x7fffffff;
        auVar316._0_8_ = 0x7fffffff7fffffff;
        auVar316._12_4_ = 0x7fffffff;
        auVar316._16_4_ = 0x7fffffff;
        auVar316._20_4_ = 0x7fffffff;
        auVar316._24_4_ = 0x7fffffff;
        auVar316._28_4_ = 0x7fffffff;
        auVar95 = vandps_avx(auVar316,local_360);
        auVar95 = vmaxps_avx(local_440,auVar95);
        auVar66._4_4_ = auVar95._4_4_ * 1.9073486e-06;
        auVar66._0_4_ = auVar95._0_4_ * 1.9073486e-06;
        auVar66._8_4_ = auVar95._8_4_ * 1.9073486e-06;
        auVar66._12_4_ = auVar95._12_4_ * 1.9073486e-06;
        auVar66._16_4_ = auVar95._16_4_ * 1.9073486e-06;
        auVar66._20_4_ = auVar95._20_4_ * 1.9073486e-06;
        auVar66._24_4_ = auVar95._24_4_ * 1.9073486e-06;
        auVar66._28_4_ = auVar95._28_4_;
        auVar95 = vandps_avx(auVar316,local_460);
        auVar95 = vcmpps_avx(auVar95,auVar66,1);
        auVar249._8_4_ = 0xff800000;
        auVar249._0_8_ = 0xff800000ff800000;
        auVar249._12_4_ = 0xff800000;
        auVar249._16_4_ = 0xff800000;
        auVar249._20_4_ = 0xff800000;
        auVar249._24_4_ = 0xff800000;
        auVar249._28_4_ = 0xff800000;
        auVar246 = vblendvps_avx(auVar249,auVar60,auVar131);
        auVar22 = auVar131 & auVar95;
        if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar22 >> 0x7f,0) != '\0') ||
              (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar22 >> 0xbf,0) != '\0') ||
            (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar22[0x1f] < '\0') {
          auVar219 = vandps_avx(auVar95,auVar131);
          auVar81 = vpackssdw_avx(auVar219._0_16_,auVar219._16_16_);
          auVar348 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar22 = vcmpps_avx(local_860,auVar348,2);
          auVar360._8_4_ = 0xff800000;
          auVar360._0_8_ = 0xff800000ff800000;
          auVar360._12_4_ = 0xff800000;
          auVar360._16_4_ = 0xff800000;
          auVar360._20_4_ = 0xff800000;
          auVar360._24_4_ = 0xff800000;
          auVar360._28_4_ = 0xff800000;
          auVar363._8_4_ = 0x7f800000;
          auVar363._0_8_ = 0x7f8000007f800000;
          auVar363._12_4_ = 0x7f800000;
          auVar363._16_4_ = 0x7f800000;
          auVar363._20_4_ = 0x7f800000;
          auVar363._24_4_ = 0x7f800000;
          auVar363._28_4_ = 0x7f800000;
          auVar95 = vblendvps_avx(auVar363,auVar360,auVar22);
          auVar143 = vpmovsxwd_avx(auVar81);
          auVar81 = vpunpckhwd_avx(auVar81,auVar81);
          auVar317._16_16_ = auVar81;
          auVar317._0_16_ = auVar143;
          auVar222 = vblendvps_avx(auVar222,auVar95,auVar317);
          auVar95 = vblendvps_avx(auVar360,auVar363,auVar22);
          auVar246 = vblendvps_avx(auVar246,auVar95,auVar317);
          auVar95 = vcmpps_avx(auVar348,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
          auVar105._0_4_ = auVar95._0_4_ ^ auVar219._0_4_;
          auVar105._4_4_ = auVar95._4_4_ ^ auVar219._4_4_;
          auVar105._8_4_ = auVar95._8_4_ ^ auVar219._8_4_;
          auVar105._12_4_ = auVar95._12_4_ ^ auVar219._12_4_;
          auVar105._16_4_ = auVar95._16_4_ ^ auVar219._16_4_;
          auVar105._20_4_ = auVar95._20_4_ ^ auVar219._20_4_;
          auVar105._24_4_ = auVar95._24_4_ ^ auVar219._24_4_;
          auVar105._28_4_ = auVar95._28_4_ ^ auVar219._28_4_;
          auVar219 = vorps_avx(auVar22,auVar105);
          auVar219 = vandps_avx(auVar131,auVar219);
        }
        auVar174 = local_960._0_28_;
        local_a00 = auVar151;
      }
      _local_3e0 = _local_7e0;
      local_3c0 = vminps_avx(local_380,auVar222);
      local_3a0 = vmaxps_avx(_local_7e0,auVar246);
      auVar95 = vcmpps_avx(_local_7e0,local_3c0,2);
      _local_4e0 = vandps_avx(auVar94,auVar95);
      auVar95 = vcmpps_avx(local_3a0,local_380,2);
      local_520 = vandps_avx(auVar94,auVar95);
      auVar94 = vorps_avx(local_520,_local_4e0);
      if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar94 >> 0x7f,0) == '\0') &&
            (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar94 >> 0xbf,0) == '\0') &&
          (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar94[0x1f])
      goto LAB_00ea3a15;
      _local_5c0 = local_3a0;
      auVar95 = _local_5c0;
      _local_5e0 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      local_540._0_4_ = auVar219._0_4_ ^ local_5e0._0_4_;
      local_540._4_4_ = auVar219._4_4_ ^ local_5e0._4_4_;
      local_540._8_4_ = auVar219._8_4_ ^ local_5e0._8_4_;
      local_540._12_4_ = auVar219._12_4_ ^ local_5e0._12_4_;
      local_540._16_4_ = auVar219._16_4_ ^ local_5e0._16_4_;
      local_540._20_4_ = auVar219._20_4_ ^ local_5e0._20_4_;
      local_540._24_4_ = auVar219._24_4_ ^ local_5e0._24_4_;
      local_540._28_4_ = (uint)auVar219._28_4_ ^ (uint)local_5e0._28_4_;
      auVar100._0_4_ =
           auVar151._0_4_ * (float)local_740._0_4_ +
           auVar174._0_4_ * (float)local_760._0_4_ + (float)local_720._0_4_ * auVar197._0_4_;
      auVar100._4_4_ =
           auVar151._4_4_ * (float)local_740._4_4_ +
           auVar174._4_4_ * (float)local_760._4_4_ + (float)local_720._4_4_ * auVar197._4_4_;
      auVar100._8_4_ =
           auVar151._8_4_ * fStack_738 + auVar174._8_4_ * fStack_758 + fStack_718 * auVar197._8_4_;
      auVar100._12_4_ =
           auVar151._12_4_ * fStack_734 +
           auVar174._12_4_ * fStack_754 + fStack_714 * auVar197._12_4_;
      auVar100._16_4_ =
           auVar151._16_4_ * fStack_730 +
           auVar174._16_4_ * fStack_750 + fStack_710 * auVar197._16_4_;
      auVar100._20_4_ =
           auVar151._20_4_ * fStack_72c +
           auVar174._20_4_ * fStack_74c + fStack_70c * auVar197._20_4_;
      auVar100._24_4_ =
           auVar151._24_4_ * fStack_728 +
           auVar174._24_4_ * fStack_748 + fStack_708 * auVar197._24_4_;
      auVar100._28_4_ = auVar219._28_4_ + local_5e0._28_4_ + auVar151._28_4_;
      auVar134._8_4_ = 0x7fffffff;
      auVar134._0_8_ = 0x7fffffff7fffffff;
      auVar134._12_4_ = 0x7fffffff;
      auVar134._16_4_ = 0x7fffffff;
      auVar134._20_4_ = 0x7fffffff;
      auVar134._24_4_ = 0x7fffffff;
      auVar134._28_4_ = 0x7fffffff;
      auVar94 = vandps_avx(auVar100,auVar134);
      auVar135._8_4_ = 0x3e99999a;
      auVar135._0_8_ = 0x3e99999a3e99999a;
      auVar135._12_4_ = 0x3e99999a;
      auVar135._16_4_ = 0x3e99999a;
      auVar135._20_4_ = 0x3e99999a;
      auVar135._24_4_ = 0x3e99999a;
      auVar135._28_4_ = 0x3e99999a;
      auVar94 = vcmpps_avx(auVar94,auVar135,1);
      auVar94 = vorps_avx(auVar94,local_540);
      auVar136._8_4_ = 3;
      auVar136._0_8_ = 0x300000003;
      auVar136._12_4_ = 3;
      auVar136._16_4_ = 3;
      auVar136._20_4_ = 3;
      auVar136._24_4_ = 3;
      auVar136._28_4_ = 3;
      auVar153._8_4_ = 2;
      auVar153._0_8_ = 0x200000002;
      auVar153._12_4_ = 2;
      auVar153._16_4_ = 2;
      auVar153._20_4_ = 2;
      auVar153._24_4_ = 2;
      auVar153._28_4_ = 2;
      auVar94 = vblendvps_avx(auVar153,auVar136,auVar94);
      local_560 = ZEXT432(local_c08);
      auVar143 = vpshufd_avx(ZEXT416(local_c08),0);
      auVar81 = vpcmpgtd_avx(auVar94._16_16_,auVar143);
      local_5a0 = auVar143._0_4_;
      fStack_59c = auVar143._4_4_;
      fStack_598 = auVar143._8_4_;
      fStack_594 = auVar143._12_4_;
      auVar143 = vpcmpgtd_avx(auVar94._0_16_,auVar143);
      auVar137._16_16_ = auVar81;
      auVar137._0_16_ = auVar143;
      local_500 = vblendps_avx(ZEXT1632(auVar143),auVar137,0xf0);
      local_4c0 = vandnps_avx(local_500,_local_4e0);
      auVar139 = ZEXT3264(local_4c0);
      auVar94 = _local_4e0 & ~local_500;
      auVar250 = ZEXT3264(local_9c0);
      local_a60 = auVar116._0_4_;
      fStack_a5c = auVar116._4_4_;
      fStack_a58 = auVar116._8_4_;
      fStack_a54 = auVar116._12_4_;
      local_a40 = auVar21._0_4_;
      fStack_a3c = auVar21._4_4_;
      fStack_a38 = auVar21._8_4_;
      fStack_a34 = auVar21._12_4_;
      local_a50 = auVar82._0_4_;
      fStack_a4c = auVar82._4_4_;
      fStack_a48 = auVar82._8_4_;
      fStack_a44 = auVar82._12_4_;
      local_a70 = auVar80._0_4_;
      fStack_a6c = auVar80._4_4_;
      fStack_a68 = auVar80._8_4_;
      fStack_a64 = auVar80._12_4_;
      if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar94 >> 0x7f,0) == '\0') &&
            (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar94 >> 0xbf,0) == '\0') &&
          (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar94[0x1f])
      {
        auVar81 = vshufps_avx(auVar118,auVar118,0);
        auVar101._16_16_ = auVar81;
        auVar101._0_16_ = auVar81;
        local_5c0._0_4_ = local_3a0._0_4_;
        local_5c0._4_4_ = local_3a0._4_4_;
        fStack_5b8 = local_3a0._8_4_;
        fStack_5b4 = local_3a0._12_4_;
        fStack_5b0 = local_3a0._16_4_;
        fStack_5ac = local_3a0._20_4_;
        fStack_5a8 = local_3a0._24_4_;
        fStack_5a4 = local_3a0._28_4_;
        auVar197 = local_740._0_28_;
        fVar159 = (float)local_5c0._0_4_;
        fVar227 = (float)local_5c0._4_4_;
        fVar179 = fStack_5b8;
        fVar229 = fStack_5b4;
        fVar180 = fStack_5b0;
        fVar231 = fStack_5ac;
        fVar181 = fStack_5a8;
        fVar236 = fStack_5a4;
        _local_5c0 = auVar95;
      }
      else {
        local_920._4_4_ = (float)local_7e0._4_4_ + local_8a0._4_4_;
        local_920._0_4_ = (float)local_7e0._0_4_ + (float)local_8a0;
        fStack_918 = fStack_7d8 + (float)uStack_898;
        fStack_914 = fStack_7d4 + uStack_898._4_4_;
        fStack_910 = fStack_7d0 + (float)uStack_890;
        fStack_90c = fStack_7cc + uStack_890._4_4_;
        fStack_908 = fStack_7c8 + (float)uStack_888;
        fStack_904 = fStack_7c4 + uStack_888._4_4_;
        do {
          auVar102._8_4_ = 0x7f800000;
          auVar102._0_8_ = 0x7f8000007f800000;
          auVar102._12_4_ = 0x7f800000;
          auVar102._16_4_ = 0x7f800000;
          auVar102._20_4_ = 0x7f800000;
          auVar102._24_4_ = 0x7f800000;
          auVar102._28_4_ = 0x7f800000;
          auVar94 = auVar139._0_32_;
          auVar219 = vblendvps_avx(auVar102,_local_7e0,auVar94);
          auVar95 = vshufps_avx(auVar219,auVar219,0xb1);
          auVar95 = vminps_avx(auVar219,auVar95);
          auVar131 = vshufpd_avx(auVar95,auVar95,5);
          auVar95 = vminps_avx(auVar95,auVar131);
          auVar131 = vperm2f128_avx(auVar95,auVar95,1);
          auVar95 = vminps_avx(auVar95,auVar131);
          auVar219 = vcmpps_avx(auVar219,auVar95,0);
          auVar95 = auVar94 & auVar219;
          if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar95 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar95 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar95 >> 0x7f,0) != '\0') ||
                (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar95 >> 0xbf,0) != '\0') ||
              (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar95[0x1f] < '\0') {
            auVar94 = vandps_avx(auVar219,auVar94);
          }
          uVar70 = vmovmskps_avx(auVar94);
          uVar73 = 0;
          if (uVar70 != 0) {
            for (; (uVar70 >> uVar73 & 1) == 0; uVar73 = uVar73 + 1) {
            }
          }
          uVar72 = (ulong)uVar73;
          *(undefined4 *)(local_4c0 + uVar72 * 4) = 0;
          fVar159 = local_1a0[uVar72];
          uVar73 = *(uint *)(local_3e0 + uVar72 * 4);
          fVar227 = auVar117._0_4_;
          if ((float)local_940._0_4_ < 0.0) {
            fVar227 = sqrtf((float)local_940._0_4_);
          }
          auVar118 = vminps_avx(auVar21,auVar116);
          auVar81 = vmaxps_avx(auVar21,auVar116);
          auVar143 = vminps_avx(auVar82,auVar80);
          auVar89 = vminps_avx(auVar118,auVar143);
          auVar118 = vmaxps_avx(auVar82,auVar80);
          auVar143 = vmaxps_avx(auVar81,auVar118);
          auVar162._8_4_ = 0x7fffffff;
          auVar162._0_8_ = 0x7fffffff7fffffff;
          auVar162._12_4_ = 0x7fffffff;
          auVar81 = vandps_avx(auVar89,auVar162);
          auVar118 = vandps_avx(auVar143,auVar162);
          auVar81 = vmaxps_avx(auVar81,auVar118);
          auVar118 = vmovshdup_avx(auVar81);
          auVar118 = vmaxss_avx(auVar118,auVar81);
          auVar81 = vshufpd_avx(auVar81,auVar81,1);
          auVar81 = vmaxss_avx(auVar81,auVar118);
          local_a00._0_4_ = auVar81._0_4_ * 1.9073486e-06;
          local_8c0._0_4_ = fVar227 * 1.9073486e-06;
          local_700._0_16_ = vshufps_avx(auVar143,auVar143,0xff);
          auVar81 = vinsertps_avx(ZEXT416(uVar73),ZEXT416((uint)fVar159),0x10);
          lVar75 = 5;
          do {
            auVar118 = vmovshdup_avx(auVar81);
            fVar184 = auVar118._0_4_;
            fVar180 = 1.0 - fVar184;
            auVar118 = vshufps_avx(auVar81,auVar81,0x55);
            fVar159 = auVar118._0_4_;
            fVar227 = auVar118._4_4_;
            fVar179 = auVar118._8_4_;
            fVar229 = auVar118._12_4_;
            auVar118 = vshufps_avx(ZEXT416((uint)fVar180),ZEXT416((uint)fVar180),0);
            fVar231 = auVar118._0_4_;
            fVar181 = auVar118._4_4_;
            fVar236 = auVar118._8_4_;
            fVar251 = auVar118._12_4_;
            fVar255 = local_a50 * fVar159 + local_a60 * fVar231;
            fVar259 = fStack_a4c * fVar227 + fStack_a5c * fVar181;
            fVar182 = fStack_a48 * fVar179 + fStack_a58 * fVar236;
            fVar183 = fStack_a44 * fVar229 + fStack_a54 * fVar251;
            auVar215._0_4_ =
                 fVar231 * (local_a60 * fVar159 + fVar231 * local_a40) + fVar159 * fVar255;
            auVar215._4_4_ =
                 fVar181 * (fStack_a5c * fVar227 + fVar181 * fStack_a3c) + fVar227 * fVar259;
            auVar215._8_4_ =
                 fVar236 * (fStack_a58 * fVar179 + fVar236 * fStack_a38) + fVar179 * fVar182;
            auVar215._12_4_ =
                 fVar251 * (fStack_a54 * fVar229 + fVar251 * fStack_a34) + fVar229 * fVar183;
            auVar163._0_4_ =
                 fVar231 * fVar255 + fVar159 * (fVar159 * local_a70 + local_a50 * fVar231);
            auVar163._4_4_ =
                 fVar181 * fVar259 + fVar227 * (fVar227 * fStack_a6c + fStack_a4c * fVar181);
            auVar163._8_4_ =
                 fVar236 * fVar182 + fVar179 * (fVar179 * fStack_a68 + fStack_a48 * fVar236);
            auVar163._12_4_ =
                 fVar251 * fVar183 + fVar229 * (fVar229 * fStack_a64 + fStack_a44 * fVar251);
            auVar118 = vshufps_avx(auVar81,auVar81,0);
            auVar119._0_4_ = auVar118._0_4_ * (float)local_930._0_4_ + 0.0;
            auVar119._4_4_ = auVar118._4_4_ * (float)local_930._4_4_ + 0.0;
            auVar119._8_4_ = auVar118._8_4_ * fStack_928 + 0.0;
            auVar119._12_4_ = auVar118._12_4_ * fStack_924 + 0.0;
            auVar85._0_4_ = fVar231 * auVar215._0_4_ + fVar159 * auVar163._0_4_;
            auVar85._4_4_ = fVar181 * auVar215._4_4_ + fVar227 * auVar163._4_4_;
            auVar85._8_4_ = fVar236 * auVar215._8_4_ + fVar179 * auVar163._8_4_;
            auVar85._12_4_ = fVar251 * auVar215._12_4_ + fVar229 * auVar163._12_4_;
            local_860._0_16_ = auVar85;
            auVar118 = vsubps_avx(auVar119,auVar85);
            _local_960 = auVar118;
            auVar118 = vdpps_avx(auVar118,auVar118,0x7f);
            fVar159 = auVar118._0_4_;
            if (fVar159 < 0.0) {
              fVar227 = sqrtf(fVar159);
            }
            else {
              auVar143 = vsqrtss_avx(auVar118,auVar118);
              fVar227 = auVar143._0_4_;
            }
            auVar143 = vsubps_avx(auVar163,auVar215);
            auVar241._0_4_ = auVar143._0_4_ * 3.0;
            auVar241._4_4_ = auVar143._4_4_ * 3.0;
            auVar241._8_4_ = auVar143._8_4_ * 3.0;
            auVar241._12_4_ = auVar143._12_4_ * 3.0;
            auVar143 = vshufps_avx(ZEXT416((uint)(fVar184 * 6.0)),ZEXT416((uint)(fVar184 * 6.0)),0);
            auVar89 = ZEXT416((uint)((fVar180 - (fVar184 + fVar184)) * 6.0));
            auVar147 = vshufps_avx(auVar89,auVar89,0);
            auVar89 = ZEXT416((uint)((fVar184 - (fVar180 + fVar180)) * 6.0));
            auVar144 = vshufps_avx(auVar89,auVar89,0);
            auVar160 = vshufps_avx(ZEXT416((uint)(fVar180 * 6.0)),ZEXT416((uint)(fVar180 * 6.0)),0);
            auVar89 = vdpps_avx(auVar241,auVar241,0x7f);
            auVar120._0_4_ =
                 auVar160._0_4_ * local_a40 +
                 auVar144._0_4_ * local_a60 +
                 auVar143._0_4_ * local_a70 + auVar147._0_4_ * local_a50;
            auVar120._4_4_ =
                 auVar160._4_4_ * fStack_a3c +
                 auVar144._4_4_ * fStack_a5c +
                 auVar143._4_4_ * fStack_a6c + auVar147._4_4_ * fStack_a4c;
            auVar120._8_4_ =
                 auVar160._8_4_ * fStack_a38 +
                 auVar144._8_4_ * fStack_a58 +
                 auVar143._8_4_ * fStack_a68 + auVar147._8_4_ * fStack_a48;
            auVar120._12_4_ =
                 auVar160._12_4_ * fStack_a34 +
                 auVar144._12_4_ * fStack_a54 +
                 auVar143._12_4_ * fStack_a64 + auVar147._12_4_ * fStack_a44;
            auVar143 = vblendps_avx(auVar89,_DAT_01f7aa10,0xe);
            auVar147 = vrsqrtss_avx(auVar143,auVar143);
            fVar229 = auVar147._0_4_;
            fVar179 = auVar89._0_4_;
            auVar147 = vdpps_avx(auVar241,auVar120,0x7f);
            auVar144 = vshufps_avx(auVar89,auVar89,0);
            auVar121._0_4_ = auVar120._0_4_ * auVar144._0_4_;
            auVar121._4_4_ = auVar120._4_4_ * auVar144._4_4_;
            auVar121._8_4_ = auVar120._8_4_ * auVar144._8_4_;
            auVar121._12_4_ = auVar120._12_4_ * auVar144._12_4_;
            auVar147 = vshufps_avx(auVar147,auVar147,0);
            auVar189._0_4_ = auVar241._0_4_ * auVar147._0_4_;
            auVar189._4_4_ = auVar241._4_4_ * auVar147._4_4_;
            auVar189._8_4_ = auVar241._8_4_ * auVar147._8_4_;
            auVar189._12_4_ = auVar241._12_4_ * auVar147._12_4_;
            auVar160 = vsubps_avx(auVar121,auVar189);
            auVar147 = vrcpss_avx(auVar143,auVar143);
            auVar143 = vmaxss_avx(ZEXT416((uint)local_a00._0_4_),
                                  ZEXT416((uint)(auVar81._0_4_ * (float)local_8c0._0_4_)));
            auVar147 = ZEXT416((uint)(auVar147._0_4_ * (2.0 - fVar179 * auVar147._0_4_)));
            auVar147 = vshufps_avx(auVar147,auVar147,0);
            uVar72 = CONCAT44(auVar241._4_4_,auVar241._0_4_);
            auVar300._0_8_ = uVar72 ^ 0x8000000080000000;
            auVar300._8_4_ = -auVar241._8_4_;
            auVar300._12_4_ = -auVar241._12_4_;
            auVar144 = ZEXT416((uint)(fVar229 * 1.5 + fVar179 * -0.5 * fVar229 * fVar229 * fVar229))
            ;
            auVar144 = vshufps_avx(auVar144,auVar144,0);
            auVar164._0_4_ = auVar144._0_4_ * auVar160._0_4_ * auVar147._0_4_;
            auVar164._4_4_ = auVar144._4_4_ * auVar160._4_4_ * auVar147._4_4_;
            auVar164._8_4_ = auVar144._8_4_ * auVar160._8_4_ * auVar147._8_4_;
            auVar164._12_4_ = auVar144._12_4_ * auVar160._12_4_ * auVar147._12_4_;
            local_880._0_4_ = auVar241._0_4_ * auVar144._0_4_;
            local_880._4_4_ = auVar241._4_4_ * auVar144._4_4_;
            local_880._8_4_ = auVar241._8_4_ * auVar144._8_4_;
            local_880._12_4_ = auVar241._12_4_ * auVar144._12_4_;
            if (fVar179 < 0.0) {
              fVar179 = sqrtf(fVar179);
            }
            else {
              auVar89 = vsqrtss_avx(auVar89,auVar89);
              fVar179 = auVar89._0_4_;
            }
            auVar89 = vdpps_avx(_local_960,local_880._0_16_,0x7f);
            fVar227 = ((float)local_a00._0_4_ / fVar179) * (fVar227 + 1.0) +
                      fVar227 * (float)local_a00._0_4_ + auVar143._0_4_;
            auVar147 = vdpps_avx(auVar300,local_880._0_16_,0x7f);
            auVar144 = vdpps_avx(_local_960,auVar164,0x7f);
            auVar160 = vdpps_avx(_local_930,local_880._0_16_,0x7f);
            auVar161 = vdpps_avx(_local_960,auVar300,0x7f);
            fVar179 = auVar147._0_4_ + auVar144._0_4_;
            fVar229 = auVar89._0_4_;
            auVar86._0_4_ = fVar229 * fVar229;
            auVar86._4_4_ = auVar89._4_4_ * auVar89._4_4_;
            auVar86._8_4_ = auVar89._8_4_ * auVar89._8_4_;
            auVar86._12_4_ = auVar89._12_4_ * auVar89._12_4_;
            auVar144 = vsubps_avx(auVar118,auVar86);
            local_880._0_16_ = ZEXT416((uint)fVar179);
            auVar147 = vdpps_avx(_local_960,_local_930,0x7f);
            fVar180 = auVar161._0_4_ - fVar229 * fVar179;
            fVar229 = auVar147._0_4_ - fVar229 * auVar160._0_4_;
            auVar147 = vrsqrtss_avx(auVar144,auVar144);
            fVar231 = auVar144._0_4_;
            fVar179 = auVar147._0_4_;
            fVar179 = fVar179 * 1.5 + fVar231 * -0.5 * fVar179 * fVar179 * fVar179;
            if (fVar231 < 0.0) {
              local_900._0_4_ = fVar180;
              local_6c0._0_4_ = fVar229;
              local_6e0._0_4_ = fVar179;
              fVar231 = sqrtf(fVar231);
              fVar179 = (float)local_6e0._0_4_;
              fVar180 = (float)local_900._0_4_;
              fVar229 = (float)local_6c0._0_4_;
            }
            else {
              auVar147 = vsqrtss_avx(auVar144,auVar144);
              fVar231 = auVar147._0_4_;
            }
            auVar161 = vpermilps_avx(local_860._0_16_,0xff);
            auVar188 = vshufps_avx(auVar241,auVar241,0xff);
            fVar180 = fVar180 * fVar179 - auVar188._0_4_;
            auVar190._0_8_ = auVar160._0_8_ ^ 0x8000000080000000;
            auVar190._8_4_ = auVar160._8_4_ ^ 0x80000000;
            auVar190._12_4_ = auVar160._12_4_ ^ 0x80000000;
            auVar216._0_4_ = -fVar180;
            auVar216._4_4_ = 0x80000000;
            auVar216._8_4_ = 0x80000000;
            auVar216._12_4_ = 0x80000000;
            auVar147 = vinsertps_avx(auVar216,ZEXT416((uint)(fVar229 * fVar179)),0x1c);
            auVar160 = vmovsldup_avx(ZEXT416((uint)(local_880._0_4_ * fVar229 * fVar179 -
                                                   auVar160._0_4_ * fVar180)));
            auVar147 = vdivps_avx(auVar147,auVar160);
            auVar144 = vinsertps_avx(local_880._0_16_,auVar190,0x10);
            auVar144 = vdivps_avx(auVar144,auVar160);
            auVar160 = vmovsldup_avx(auVar89);
            auVar91 = ZEXT416((uint)(fVar231 - auVar161._0_4_));
            auVar161 = vmovsldup_avx(auVar91);
            auVar145._0_4_ = auVar160._0_4_ * auVar147._0_4_ + auVar161._0_4_ * auVar144._0_4_;
            auVar145._4_4_ = auVar160._4_4_ * auVar147._4_4_ + auVar161._4_4_ * auVar144._4_4_;
            auVar145._8_4_ = auVar160._8_4_ * auVar147._8_4_ + auVar161._8_4_ * auVar144._8_4_;
            auVar145._12_4_ = auVar160._12_4_ * auVar147._12_4_ + auVar161._12_4_ * auVar144._12_4_;
            auVar81 = vsubps_avx(auVar81,auVar145);
            auVar146._8_4_ = 0x7fffffff;
            auVar146._0_8_ = 0x7fffffff7fffffff;
            auVar146._12_4_ = 0x7fffffff;
            auVar89 = vandps_avx(auVar89,auVar146);
            if (auVar89._0_4_ < fVar227) {
              auVar165._8_4_ = 0x7fffffff;
              auVar165._0_8_ = 0x7fffffff7fffffff;
              auVar165._12_4_ = 0x7fffffff;
              auVar89 = vandps_avx(auVar91,auVar165);
              if (auVar89._0_4_ < (float)local_700._0_4_ * 1.9073486e-06 + fVar227 + auVar143._0_4_)
              {
                fVar227 = auVar81._0_4_ + (float)local_810._0_4_;
                auVar250 = ZEXT3264(local_9c0);
                if ((fVar210 <= fVar227) &&
                   (fVar179 = *(float *)(ray + k * 4 + 0x80), fVar227 <= fVar179)) {
                  auVar143 = vmovshdup_avx(auVar81);
                  fVar229 = auVar143._0_4_;
                  if ((0.0 <= fVar229) && (fVar229 <= 1.0)) {
                    auVar118 = vrsqrtss_avx(auVar118,auVar118);
                    fVar180 = auVar118._0_4_;
                    pGVar4 = (context->scene->geometries).items[uVar69].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      auVar118 = ZEXT416((uint)(fVar180 * 1.5 +
                                               fVar159 * -0.5 * fVar180 * fVar180 * fVar180));
                      auVar118 = vshufps_avx(auVar118,auVar118,0);
                      auVar166._0_4_ = auVar118._0_4_ * (float)local_960._0_4_;
                      auVar166._4_4_ = auVar118._4_4_ * (float)local_960._4_4_;
                      auVar166._8_4_ = auVar118._8_4_ * fStack_958;
                      auVar166._12_4_ = auVar118._12_4_ * fStack_954;
                      auVar122._0_4_ = auVar241._0_4_ + auVar188._0_4_ * auVar166._0_4_;
                      auVar122._4_4_ = auVar241._4_4_ + auVar188._4_4_ * auVar166._4_4_;
                      auVar122._8_4_ = auVar241._8_4_ + auVar188._8_4_ * auVar166._8_4_;
                      auVar122._12_4_ = auVar241._12_4_ + auVar188._12_4_ * auVar166._12_4_;
                      auVar118 = vshufps_avx(auVar166,auVar166,0xc9);
                      auVar143 = vshufps_avx(auVar241,auVar241,0xc9);
                      auVar167._0_4_ = auVar143._0_4_ * auVar166._0_4_;
                      auVar167._4_4_ = auVar143._4_4_ * auVar166._4_4_;
                      auVar167._8_4_ = auVar143._8_4_ * auVar166._8_4_;
                      auVar167._12_4_ = auVar143._12_4_ * auVar166._12_4_;
                      auVar191._0_4_ = auVar241._0_4_ * auVar118._0_4_;
                      auVar191._4_4_ = auVar241._4_4_ * auVar118._4_4_;
                      auVar191._8_4_ = auVar241._8_4_ * auVar118._8_4_;
                      auVar191._12_4_ = auVar241._12_4_ * auVar118._12_4_;
                      auVar89 = vsubps_avx(auVar191,auVar167);
                      auVar118 = vshufps_avx(auVar89,auVar89,0xc9);
                      auVar143 = vshufps_avx(auVar122,auVar122,0xc9);
                      auVar192._0_4_ = auVar143._0_4_ * auVar118._0_4_;
                      auVar192._4_4_ = auVar143._4_4_ * auVar118._4_4_;
                      auVar192._8_4_ = auVar143._8_4_ * auVar118._8_4_;
                      auVar192._12_4_ = auVar143._12_4_ * auVar118._12_4_;
                      auVar118 = vshufps_avx(auVar89,auVar89,0xd2);
                      auVar123._0_4_ = auVar122._0_4_ * auVar118._0_4_;
                      auVar123._4_4_ = auVar122._4_4_ * auVar118._4_4_;
                      auVar123._8_4_ = auVar122._8_4_ * auVar118._8_4_;
                      auVar123._12_4_ = auVar122._12_4_ * auVar118._12_4_;
                      auVar118 = vsubps_avx(auVar192,auVar123);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar227;
                        uVar1 = vextractps_avx(auVar118,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar1;
                        uVar1 = vextractps_avx(auVar118,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
                        *(int *)(ray + k * 4 + 0xe0) = auVar118._0_4_;
                        *(float *)(ray + k * 4 + 0xf0) = fVar229;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_8e0;
                        *(uint *)(ray + k * 4 + 0x120) = uVar69;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_650 = vshufps_avx(auVar81,auVar81,0x55);
                        auVar81 = vshufps_avx(auVar118,auVar118,0x55);
                        auStack_670 = vshufps_avx(auVar118,auVar118,0xaa);
                        local_660 = vshufps_avx(auVar118,auVar118,0);
                        local_680 = (RTCHitN  [16])auVar81;
                        local_640 = ZEXT816(0) << 0x20;
                        local_630 = local_6a0._0_8_;
                        uStack_628 = local_6a0._8_8_;
                        local_620 = local_690._0_8_;
                        uStack_618 = local_690._8_8_;
                        uVar73 = context->user->instID[0];
                        _local_610 = CONCAT44(uVar73,uVar73);
                        _uStack_608 = CONCAT44(uVar73,uVar73);
                        uVar73 = context->user->instPrimID[0];
                        auVar124._4_4_ = uVar73;
                        auVar124._0_4_ = uVar73;
                        auVar124._8_4_ = uVar73;
                        auVar124._12_4_ = uVar73;
                        auStack_600 = auVar124;
                        *(float *)(ray + k * 4 + 0x80) = fVar227;
                        local_840._0_16_ = *local_968;
                        local_a30.valid = (int *)local_840;
                        local_a30.geometryUserPtr = pGVar4->userPtr;
                        local_a30.context = context->user;
                        local_a30.hit = local_680;
                        local_a30.N = 4;
                        auVar118 = *local_968;
                        local_a30.ray = (RTCRayN *)ray;
                        if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar4->intersectionFilterN)(&local_a30);
                          auVar250._8_56_ = extraout_var;
                          auVar250._0_8_ = extraout_XMM1_Qa;
                          auVar124 = auVar250._0_16_;
                          auVar250 = ZEXT3264(local_9c0);
                          auVar118 = local_840._0_16_;
                        }
                        if (auVar118 == (undefined1  [16])0x0) {
                          auVar81 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                          auVar118 = vpcmpeqd_avx(auVar124,auVar124);
                          auVar81 = auVar81 ^ auVar118;
                        }
                        else {
                          p_Var5 = context->args->filter;
                          auVar143 = vpcmpeqd_avx(auVar81,auVar81);
                          if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var5)(&local_a30);
                            auVar250 = ZEXT3264(local_9c0);
                            auVar143 = vpcmpeqd_avx(auVar143,auVar143);
                            auVar118 = local_840._0_16_;
                          }
                          auVar89 = vpcmpeqd_avx(auVar118,_DAT_01f7aa10);
                          auVar81 = auVar89 ^ auVar143;
                          if (auVar118 != (undefined1  [16])0x0) {
                            auVar89 = auVar89 ^ auVar143;
                            auVar118 = vmaskmovps_avx(auVar89,*(undefined1 (*) [16])local_a30.hit);
                            *(undefined1 (*) [16])(local_a30.ray + 0xc0) = auVar118;
                            auVar118 = vmaskmovps_avx(auVar89,*(undefined1 (*) [16])
                                                               (local_a30.hit + 0x10));
                            *(undefined1 (*) [16])(local_a30.ray + 0xd0) = auVar118;
                            auVar118 = vmaskmovps_avx(auVar89,*(undefined1 (*) [16])
                                                               (local_a30.hit + 0x20));
                            *(undefined1 (*) [16])(local_a30.ray + 0xe0) = auVar118;
                            auVar118 = vmaskmovps_avx(auVar89,*(undefined1 (*) [16])
                                                               (local_a30.hit + 0x30));
                            *(undefined1 (*) [16])(local_a30.ray + 0xf0) = auVar118;
                            auVar118 = vmaskmovps_avx(auVar89,*(undefined1 (*) [16])
                                                               (local_a30.hit + 0x40));
                            *(undefined1 (*) [16])(local_a30.ray + 0x100) = auVar118;
                            auVar118 = vmaskmovps_avx(auVar89,*(undefined1 (*) [16])
                                                               (local_a30.hit + 0x50));
                            *(undefined1 (*) [16])(local_a30.ray + 0x110) = auVar118;
                            auVar118 = vmaskmovps_avx(auVar89,*(undefined1 (*) [16])
                                                               (local_a30.hit + 0x60));
                            *(undefined1 (*) [16])(local_a30.ray + 0x120) = auVar118;
                            auVar118 = vmaskmovps_avx(auVar89,*(undefined1 (*) [16])
                                                               (local_a30.hit + 0x70));
                            *(undefined1 (*) [16])(local_a30.ray + 0x130) = auVar118;
                            auVar118 = vmaskmovps_avx(auVar89,*(undefined1 (*) [16])
                                                               (local_a30.hit + 0x80));
                            *(undefined1 (*) [16])(local_a30.ray + 0x140) = auVar118;
                          }
                        }
                        auVar87._8_8_ = 0x100000001;
                        auVar87._0_8_ = 0x100000001;
                        if ((auVar87 & auVar81) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar179;
                        }
                      }
                    }
                  }
                }
                break;
              }
            }
            lVar75 = lVar75 + -1;
            auVar250 = ZEXT3264(local_9c0);
          } while (lVar75 != 0);
          auVar219 = local_4c0;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar101._4_4_ = uVar1;
          auVar101._0_4_ = uVar1;
          auVar101._8_4_ = uVar1;
          auVar101._12_4_ = uVar1;
          auVar101._16_4_ = uVar1;
          auVar101._20_4_ = uVar1;
          auVar101._24_4_ = uVar1;
          auVar101._28_4_ = uVar1;
          auVar94 = vcmpps_avx(_local_920,auVar101,2);
          local_4c0 = vandps_avx(auVar94,local_4c0);
          auVar139 = ZEXT3264(local_4c0);
          auVar219 = auVar219 & auVar94;
          auVar197 = local_740._0_28_;
        } while ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (auVar219 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar219 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(auVar219 >> 0x7f,0) != '\0') ||
                   (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(auVar219 >> 0xbf,0) != '\0') ||
                 (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 auVar219[0x1f] < '\0');
        auVar139 = ZEXT3264(local_3a0);
        fVar159 = (float)local_5c0._0_4_;
        fVar227 = (float)local_5c0._4_4_;
        fVar179 = fStack_5b8;
        fVar229 = fStack_5b4;
        fVar180 = fStack_5b0;
        fVar231 = fStack_5ac;
        fVar181 = fStack_5a8;
        fVar236 = fStack_5a4;
      }
      auVar322 = ZEXT3264(local_9a0);
      auVar303 = ZEXT3264(local_9e0);
      auVar138._0_4_ =
           auVar197._0_4_ * (float)local_780._0_4_ +
           (float)local_760._0_4_ * (float)local_7a0._0_4_ +
           (float)local_720._0_4_ * (float)local_7c0._0_4_;
      auVar138._4_4_ =
           auVar197._4_4_ * (float)local_780._4_4_ +
           (float)local_760._4_4_ * (float)local_7a0._4_4_ +
           (float)local_720._4_4_ * (float)local_7c0._4_4_;
      auVar138._8_4_ =
           auVar197._8_4_ * fStack_778 + fStack_758 * fStack_798 + fStack_718 * fStack_7b8;
      auVar138._12_4_ =
           auVar197._12_4_ * fStack_774 + fStack_754 * fStack_794 + fStack_714 * fStack_7b4;
      auVar138._16_4_ =
           auVar197._16_4_ * fStack_770 + fStack_750 * fStack_790 + fStack_710 * fStack_7b0;
      auVar138._20_4_ =
           auVar197._20_4_ * fStack_76c + fStack_74c * fStack_78c + fStack_70c * fStack_7ac;
      auVar138._24_4_ =
           auVar197._24_4_ * fStack_768 + fStack_748 * fStack_788 + fStack_708 * fStack_7a8;
      auVar138._28_4_ = fStack_744 + fStack_744 + auVar139._28_4_;
      auVar154._8_4_ = 0x7fffffff;
      auVar154._0_8_ = 0x7fffffff7fffffff;
      auVar154._12_4_ = 0x7fffffff;
      auVar154._16_4_ = 0x7fffffff;
      auVar154._20_4_ = 0x7fffffff;
      auVar154._24_4_ = 0x7fffffff;
      auVar154._28_4_ = 0x7fffffff;
      auVar94 = vandps_avx(auVar138,auVar154);
      auVar155._8_4_ = 0x3e99999a;
      auVar155._0_8_ = 0x3e99999a3e99999a;
      auVar155._12_4_ = 0x3e99999a;
      auVar155._16_4_ = 0x3e99999a;
      auVar155._20_4_ = 0x3e99999a;
      auVar155._24_4_ = 0x3e99999a;
      auVar155._28_4_ = 0x3e99999a;
      auVar94 = vcmpps_avx(auVar94,auVar155,1);
      auVar219 = vorps_avx(auVar94,local_540);
      auVar156._0_4_ = fVar159 + (float)local_8a0;
      auVar156._4_4_ = fVar227 + local_8a0._4_4_;
      auVar156._8_4_ = fVar179 + (float)uStack_898;
      auVar156._12_4_ = fVar229 + uStack_898._4_4_;
      auVar156._16_4_ = fVar180 + (float)uStack_890;
      auVar156._20_4_ = fVar231 + uStack_890._4_4_;
      auVar156._24_4_ = fVar181 + (float)uStack_888;
      auVar156._28_4_ = fVar236 + uStack_888._4_4_;
      auVar94 = vcmpps_avx(auVar156,auVar101,2);
      _local_7c0 = vandps_avx(auVar94,local_520);
      auVar157._8_4_ = 3;
      auVar157._0_8_ = 0x300000003;
      auVar157._12_4_ = 3;
      auVar157._16_4_ = 3;
      auVar157._20_4_ = 3;
      auVar157._24_4_ = 3;
      auVar157._28_4_ = 3;
      auVar178._8_4_ = 2;
      auVar178._0_8_ = 0x200000002;
      auVar178._12_4_ = 2;
      auVar178._16_4_ = 2;
      auVar178._20_4_ = 2;
      auVar178._24_4_ = 2;
      auVar178._28_4_ = 2;
      auVar94 = vblendvps_avx(auVar178,auVar157,auVar219);
      auVar67._4_4_ = fStack_59c;
      auVar67._0_4_ = local_5a0;
      auVar67._8_4_ = fStack_598;
      auVar67._12_4_ = fStack_594;
      auVar81 = vpcmpgtd_avx(auVar94._16_16_,auVar67);
      auVar118 = vpshufd_avx(local_560._0_16_,0);
      auVar118 = vpcmpgtd_avx(auVar94._0_16_,auVar118);
      auVar158._16_16_ = auVar81;
      auVar158._0_16_ = auVar101._0_16_;
      _local_7a0 = vblendps_avx(ZEXT1632(auVar118),auVar158,0xf0);
      auVar94 = vandnps_avx(_local_7a0,_local_7c0);
      auVar219 = _local_7c0 & ~_local_7a0;
      local_840 = auVar94;
      if ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar219 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar219 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar219 >> 0x7f,0) != '\0') ||
            (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar219 >> 0xbf,0) != '\0') ||
          (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar219[0x1f] < '\0') {
        local_780._4_4_ = local_8a0._4_4_ + local_3a0._4_4_;
        local_780._0_4_ = (float)local_8a0 + local_3a0._0_4_;
        fStack_778 = (float)uStack_898 + local_3a0._8_4_;
        fStack_774 = uStack_898._4_4_ + local_3a0._12_4_;
        fStack_770 = (float)uStack_890 + local_3a0._16_4_;
        fStack_76c = uStack_890._4_4_ + local_3a0._20_4_;
        fStack_768 = (float)uStack_888 + local_3a0._24_4_;
        fStack_764 = uStack_888._4_4_ + local_3a0._28_4_;
        _local_920 = local_3a0;
        do {
          auVar103._8_4_ = 0x7f800000;
          auVar103._0_8_ = 0x7f8000007f800000;
          auVar103._12_4_ = 0x7f800000;
          auVar103._16_4_ = 0x7f800000;
          auVar103._20_4_ = 0x7f800000;
          auVar103._24_4_ = 0x7f800000;
          auVar103._28_4_ = 0x7f800000;
          auVar219 = vblendvps_avx(auVar103,_local_920,auVar94);
          auVar95 = vshufps_avx(auVar219,auVar219,0xb1);
          auVar95 = vminps_avx(auVar219,auVar95);
          auVar131 = vshufpd_avx(auVar95,auVar95,5);
          auVar95 = vminps_avx(auVar95,auVar131);
          auVar131 = vperm2f128_avx(auVar95,auVar95,1);
          auVar95 = vminps_avx(auVar95,auVar131);
          auVar95 = vcmpps_avx(auVar219,auVar95,0);
          auVar131 = auVar94 & auVar95;
          auVar219 = auVar94;
          if ((((((((auVar131 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar131 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar131 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar131 >> 0x7f,0) != '\0') ||
                (auVar131 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar131 >> 0xbf,0) != '\0') ||
              (auVar131 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar131[0x1f] < '\0') {
            auVar219 = vandps_avx(auVar95,auVar94);
          }
          uVar70 = vmovmskps_avx(auVar219);
          uVar73 = 0;
          if (uVar70 != 0) {
            for (; (uVar70 >> uVar73 & 1) == 0; uVar73 = uVar73 + 1) {
            }
          }
          uVar72 = (ulong)uVar73;
          local_840 = auVar94;
          *(undefined4 *)(local_840 + uVar72 * 4) = 0;
          fVar159 = local_1c0[uVar72];
          uVar73 = *(uint *)(local_380 + uVar72 * 4);
          fVar227 = auVar20._0_4_;
          if ((float)local_940._0_4_ < 0.0) {
            fVar227 = sqrtf((float)local_940._0_4_);
          }
          auVar118 = vminps_avx(auVar21,auVar116);
          auVar81 = vmaxps_avx(auVar21,auVar116);
          auVar143 = vminps_avx(auVar82,auVar80);
          auVar89 = vminps_avx(auVar118,auVar143);
          auVar118 = vmaxps_avx(auVar82,auVar80);
          auVar143 = vmaxps_avx(auVar81,auVar118);
          auVar168._8_4_ = 0x7fffffff;
          auVar168._0_8_ = 0x7fffffff7fffffff;
          auVar168._12_4_ = 0x7fffffff;
          auVar81 = vandps_avx(auVar89,auVar168);
          auVar118 = vandps_avx(auVar143,auVar168);
          auVar81 = vmaxps_avx(auVar81,auVar118);
          auVar118 = vmovshdup_avx(auVar81);
          auVar118 = vmaxss_avx(auVar118,auVar81);
          auVar81 = vshufpd_avx(auVar81,auVar81,1);
          auVar81 = vmaxss_avx(auVar81,auVar118);
          local_a00._0_4_ = auVar81._0_4_ * 1.9073486e-06;
          local_880._0_4_ = fVar227 * 1.9073486e-06;
          local_700._0_16_ = vshufps_avx(auVar143,auVar143,0xff);
          auVar81 = vinsertps_avx(ZEXT416(uVar73),ZEXT416((uint)fVar159),0x10);
          lVar75 = 5;
          do {
            auVar118 = vmovshdup_avx(auVar81);
            fVar184 = auVar118._0_4_;
            fVar180 = 1.0 - fVar184;
            auVar118 = vshufps_avx(auVar81,auVar81,0x55);
            fVar159 = auVar118._0_4_;
            fVar227 = auVar118._4_4_;
            fVar179 = auVar118._8_4_;
            fVar229 = auVar118._12_4_;
            auVar118 = vshufps_avx(ZEXT416((uint)fVar180),ZEXT416((uint)fVar180),0);
            fVar231 = auVar118._0_4_;
            fVar181 = auVar118._4_4_;
            fVar236 = auVar118._8_4_;
            fVar251 = auVar118._12_4_;
            fVar255 = local_a50 * fVar159 + local_a60 * fVar231;
            fVar259 = fStack_a4c * fVar227 + fStack_a5c * fVar181;
            fVar182 = fStack_a48 * fVar179 + fStack_a58 * fVar236;
            fVar183 = fStack_a44 * fVar229 + fStack_a54 * fVar251;
            auVar217._0_4_ =
                 fVar231 * (local_a60 * fVar159 + fVar231 * local_a40) + fVar159 * fVar255;
            auVar217._4_4_ =
                 fVar181 * (fStack_a5c * fVar227 + fVar181 * fStack_a3c) + fVar227 * fVar259;
            auVar217._8_4_ =
                 fVar236 * (fStack_a58 * fVar179 + fVar236 * fStack_a38) + fVar179 * fVar182;
            auVar217._12_4_ =
                 fVar251 * (fStack_a54 * fVar229 + fVar251 * fStack_a34) + fVar229 * fVar183;
            auVar169._0_4_ =
                 fVar231 * fVar255 + fVar159 * (fVar159 * local_a70 + local_a50 * fVar231);
            auVar169._4_4_ =
                 fVar181 * fVar259 + fVar227 * (fVar227 * fStack_a6c + fStack_a4c * fVar181);
            auVar169._8_4_ =
                 fVar236 * fVar182 + fVar179 * (fVar179 * fStack_a68 + fStack_a48 * fVar236);
            auVar169._12_4_ =
                 fVar251 * fVar183 + fVar229 * (fVar229 * fStack_a64 + fStack_a44 * fVar251);
            auVar118 = vshufps_avx(auVar81,auVar81,0);
            auVar125._0_4_ = auVar118._0_4_ * (float)local_930._0_4_ + 0.0;
            auVar125._4_4_ = auVar118._4_4_ * (float)local_930._4_4_ + 0.0;
            auVar125._8_4_ = auVar118._8_4_ * fStack_928 + 0.0;
            auVar125._12_4_ = auVar118._12_4_ * fStack_924 + 0.0;
            auVar88._0_4_ = fVar231 * auVar217._0_4_ + fVar159 * auVar169._0_4_;
            auVar88._4_4_ = fVar181 * auVar217._4_4_ + fVar227 * auVar169._4_4_;
            auVar88._8_4_ = fVar236 * auVar217._8_4_ + fVar179 * auVar169._8_4_;
            auVar88._12_4_ = fVar251 * auVar217._12_4_ + fVar229 * auVar169._12_4_;
            local_860._0_16_ = auVar88;
            auVar118 = vsubps_avx(auVar125,auVar88);
            _local_960 = auVar118;
            auVar118 = vdpps_avx(auVar118,auVar118,0x7f);
            fVar159 = auVar118._0_4_;
            if (fVar159 < 0.0) {
              fVar227 = sqrtf(fVar159);
            }
            else {
              auVar143 = vsqrtss_avx(auVar118,auVar118);
              fVar227 = auVar143._0_4_;
            }
            auVar143 = vsubps_avx(auVar169,auVar217);
            auVar242._0_4_ = auVar143._0_4_ * 3.0;
            auVar242._4_4_ = auVar143._4_4_ * 3.0;
            auVar242._8_4_ = auVar143._8_4_ * 3.0;
            auVar242._12_4_ = auVar143._12_4_ * 3.0;
            auVar143 = vshufps_avx(ZEXT416((uint)(fVar184 * 6.0)),ZEXT416((uint)(fVar184 * 6.0)),0);
            auVar89 = ZEXT416((uint)((fVar180 - (fVar184 + fVar184)) * 6.0));
            auVar147 = vshufps_avx(auVar89,auVar89,0);
            auVar89 = ZEXT416((uint)((fVar184 - (fVar180 + fVar180)) * 6.0));
            auVar144 = vshufps_avx(auVar89,auVar89,0);
            auVar160 = vshufps_avx(ZEXT416((uint)(fVar180 * 6.0)),ZEXT416((uint)(fVar180 * 6.0)),0);
            auVar89 = vdpps_avx(auVar242,auVar242,0x7f);
            auVar126._0_4_ =
                 auVar160._0_4_ * local_a40 +
                 auVar144._0_4_ * local_a60 +
                 auVar143._0_4_ * local_a70 + auVar147._0_4_ * local_a50;
            auVar126._4_4_ =
                 auVar160._4_4_ * fStack_a3c +
                 auVar144._4_4_ * fStack_a5c +
                 auVar143._4_4_ * fStack_a6c + auVar147._4_4_ * fStack_a4c;
            auVar126._8_4_ =
                 auVar160._8_4_ * fStack_a38 +
                 auVar144._8_4_ * fStack_a58 +
                 auVar143._8_4_ * fStack_a68 + auVar147._8_4_ * fStack_a48;
            auVar126._12_4_ =
                 auVar160._12_4_ * fStack_a34 +
                 auVar144._12_4_ * fStack_a54 +
                 auVar143._12_4_ * fStack_a64 + auVar147._12_4_ * fStack_a44;
            auVar143 = vblendps_avx(auVar89,_DAT_01f7aa10,0xe);
            auVar147 = vrsqrtss_avx(auVar143,auVar143);
            fVar229 = auVar147._0_4_;
            fVar179 = auVar89._0_4_;
            auVar147 = vdpps_avx(auVar242,auVar126,0x7f);
            auVar144 = vshufps_avx(auVar89,auVar89,0);
            auVar127._0_4_ = auVar126._0_4_ * auVar144._0_4_;
            auVar127._4_4_ = auVar126._4_4_ * auVar144._4_4_;
            auVar127._8_4_ = auVar126._8_4_ * auVar144._8_4_;
            auVar127._12_4_ = auVar126._12_4_ * auVar144._12_4_;
            auVar147 = vshufps_avx(auVar147,auVar147,0);
            auVar193._0_4_ = auVar242._0_4_ * auVar147._0_4_;
            auVar193._4_4_ = auVar242._4_4_ * auVar147._4_4_;
            auVar193._8_4_ = auVar242._8_4_ * auVar147._8_4_;
            auVar193._12_4_ = auVar242._12_4_ * auVar147._12_4_;
            auVar160 = vsubps_avx(auVar127,auVar193);
            auVar147 = vrcpss_avx(auVar143,auVar143);
            auVar143 = vmaxss_avx(ZEXT416((uint)local_a00._0_4_),
                                  ZEXT416((uint)(auVar81._0_4_ * (float)local_880._0_4_)));
            auVar147 = ZEXT416((uint)(auVar147._0_4_ * (2.0 - fVar179 * auVar147._0_4_)));
            auVar147 = vshufps_avx(auVar147,auVar147,0);
            uVar72 = CONCAT44(auVar242._4_4_,auVar242._0_4_);
            auVar301._0_8_ = uVar72 ^ 0x8000000080000000;
            auVar301._8_4_ = -auVar242._8_4_;
            auVar301._12_4_ = -auVar242._12_4_;
            auVar144 = ZEXT416((uint)(fVar229 * 1.5 + fVar179 * -0.5 * fVar229 * fVar229 * fVar229))
            ;
            auVar144 = vshufps_avx(auVar144,auVar144,0);
            auVar170._0_4_ = auVar144._0_4_ * auVar160._0_4_ * auVar147._0_4_;
            auVar170._4_4_ = auVar144._4_4_ * auVar160._4_4_ * auVar147._4_4_;
            auVar170._8_4_ = auVar144._8_4_ * auVar160._8_4_ * auVar147._8_4_;
            auVar170._12_4_ = auVar144._12_4_ * auVar160._12_4_ * auVar147._12_4_;
            auVar306._0_4_ = auVar242._0_4_ * auVar144._0_4_;
            auVar306._4_4_ = auVar242._4_4_ * auVar144._4_4_;
            auVar306._8_4_ = auVar242._8_4_ * auVar144._8_4_;
            auVar306._12_4_ = auVar242._12_4_ * auVar144._12_4_;
            if (fVar179 < 0.0) {
              local_8c0._0_16_ = auVar306;
              fVar179 = sqrtf(fVar179);
              auVar306 = local_8c0._0_16_;
            }
            else {
              auVar89 = vsqrtss_avx(auVar89,auVar89);
              fVar179 = auVar89._0_4_;
            }
            auVar89 = vdpps_avx(_local_960,auVar306,0x7f);
            fVar227 = ((float)local_a00._0_4_ / fVar179) * (fVar227 + 1.0) +
                      fVar227 * (float)local_a00._0_4_ + auVar143._0_4_;
            auVar147 = vdpps_avx(auVar301,auVar306,0x7f);
            auVar144 = vdpps_avx(_local_960,auVar170,0x7f);
            auVar160 = vdpps_avx(_local_930,auVar306,0x7f);
            auVar161 = vdpps_avx(_local_960,auVar301,0x7f);
            fVar179 = auVar147._0_4_ + auVar144._0_4_;
            fVar229 = auVar89._0_4_;
            auVar90._0_4_ = fVar229 * fVar229;
            auVar90._4_4_ = auVar89._4_4_ * auVar89._4_4_;
            auVar90._8_4_ = auVar89._8_4_ * auVar89._8_4_;
            auVar90._12_4_ = auVar89._12_4_ * auVar89._12_4_;
            auVar144 = vsubps_avx(auVar118,auVar90);
            auVar147 = vdpps_avx(_local_960,_local_930,0x7f);
            fVar180 = auVar161._0_4_ - fVar179 * fVar229;
            fVar231 = auVar147._0_4_ - fVar229 * auVar160._0_4_;
            auVar147 = vrsqrtss_avx(auVar144,auVar144);
            fVar181 = auVar144._0_4_;
            fVar229 = auVar147._0_4_;
            fVar229 = fVar229 * 1.5 + fVar181 * -0.5 * fVar229 * fVar229 * fVar229;
            if (fVar181 < 0.0) {
              local_8c0._0_16_ = auVar160;
              local_900._0_4_ = fVar180;
              local_6c0._0_4_ = fVar231;
              local_6e0._0_4_ = fVar229;
              fVar181 = sqrtf(fVar181);
              fVar229 = (float)local_6e0._0_4_;
              fVar180 = (float)local_900._0_4_;
              fVar231 = (float)local_6c0._0_4_;
              auVar160 = local_8c0._0_16_;
            }
            else {
              auVar147 = vsqrtss_avx(auVar144,auVar144);
              fVar181 = auVar147._0_4_;
            }
            auVar322 = ZEXT3264(local_9a0);
            auVar303 = ZEXT3264(local_9e0);
            auVar161 = vpermilps_avx(local_860._0_16_,0xff);
            auVar188 = vshufps_avx(auVar242,auVar242,0xff);
            fVar180 = fVar180 * fVar229 - auVar188._0_4_;
            auVar194._0_8_ = auVar160._0_8_ ^ 0x8000000080000000;
            auVar194._8_4_ = auVar160._8_4_ ^ 0x80000000;
            auVar194._12_4_ = auVar160._12_4_ ^ 0x80000000;
            auVar218._0_4_ = -fVar180;
            auVar218._4_4_ = 0x80000000;
            auVar218._8_4_ = 0x80000000;
            auVar218._12_4_ = 0x80000000;
            auVar147 = vinsertps_avx(auVar218,ZEXT416((uint)(fVar231 * fVar229)),0x1c);
            auVar160 = vmovsldup_avx(ZEXT416((uint)(fVar179 * fVar231 * fVar229 -
                                                   auVar160._0_4_ * fVar180)));
            auVar147 = vdivps_avx(auVar147,auVar160);
            auVar144 = vinsertps_avx(ZEXT416((uint)fVar179),auVar194,0x10);
            auVar144 = vdivps_avx(auVar144,auVar160);
            auVar160 = vmovsldup_avx(auVar89);
            auVar91 = ZEXT416((uint)(fVar181 - auVar161._0_4_));
            auVar161 = vmovsldup_avx(auVar91);
            auVar148._0_4_ = auVar160._0_4_ * auVar147._0_4_ + auVar161._0_4_ * auVar144._0_4_;
            auVar148._4_4_ = auVar160._4_4_ * auVar147._4_4_ + auVar161._4_4_ * auVar144._4_4_;
            auVar148._8_4_ = auVar160._8_4_ * auVar147._8_4_ + auVar161._8_4_ * auVar144._8_4_;
            auVar148._12_4_ = auVar160._12_4_ * auVar147._12_4_ + auVar161._12_4_ * auVar144._12_4_;
            auVar81 = vsubps_avx(auVar81,auVar148);
            auVar149._8_4_ = 0x7fffffff;
            auVar149._0_8_ = 0x7fffffff7fffffff;
            auVar149._12_4_ = 0x7fffffff;
            auVar89 = vandps_avx(auVar89,auVar149);
            if (auVar89._0_4_ < fVar227) {
              auVar171._8_4_ = 0x7fffffff;
              auVar171._0_8_ = 0x7fffffff7fffffff;
              auVar171._12_4_ = 0x7fffffff;
              auVar89 = vandps_avx(auVar91,auVar171);
              if (auVar89._0_4_ < (float)local_700._0_4_ * 1.9073486e-06 + fVar227 + auVar143._0_4_)
              {
                fVar227 = auVar81._0_4_ + (float)local_810._0_4_;
                auVar250 = ZEXT3264(local_9c0);
                if ((fVar210 <= fVar227) &&
                   (fVar179 = *(float *)(ray + k * 4 + 0x80), fVar227 <= fVar179)) {
                  auVar143 = vmovshdup_avx(auVar81);
                  fVar229 = auVar143._0_4_;
                  if ((0.0 <= fVar229) && (fVar229 <= 1.0)) {
                    auVar118 = vrsqrtss_avx(auVar118,auVar118);
                    fVar180 = auVar118._0_4_;
                    pGVar4 = (context->scene->geometries).items[uVar69].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      auVar118 = ZEXT416((uint)(fVar180 * 1.5 +
                                               fVar159 * -0.5 * fVar180 * fVar180 * fVar180));
                      auVar118 = vshufps_avx(auVar118,auVar118,0);
                      auVar172._0_4_ = auVar118._0_4_ * (float)local_960._0_4_;
                      auVar172._4_4_ = auVar118._4_4_ * (float)local_960._4_4_;
                      auVar172._8_4_ = auVar118._8_4_ * fStack_958;
                      auVar172._12_4_ = auVar118._12_4_ * fStack_954;
                      auVar128._0_4_ = auVar242._0_4_ + auVar188._0_4_ * auVar172._0_4_;
                      auVar128._4_4_ = auVar242._4_4_ + auVar188._4_4_ * auVar172._4_4_;
                      auVar128._8_4_ = auVar242._8_4_ + auVar188._8_4_ * auVar172._8_4_;
                      auVar128._12_4_ = auVar242._12_4_ + auVar188._12_4_ * auVar172._12_4_;
                      auVar118 = vshufps_avx(auVar172,auVar172,0xc9);
                      auVar143 = vshufps_avx(auVar242,auVar242,0xc9);
                      auVar173._0_4_ = auVar143._0_4_ * auVar172._0_4_;
                      auVar173._4_4_ = auVar143._4_4_ * auVar172._4_4_;
                      auVar173._8_4_ = auVar143._8_4_ * auVar172._8_4_;
                      auVar173._12_4_ = auVar143._12_4_ * auVar172._12_4_;
                      auVar195._0_4_ = auVar242._0_4_ * auVar118._0_4_;
                      auVar195._4_4_ = auVar242._4_4_ * auVar118._4_4_;
                      auVar195._8_4_ = auVar242._8_4_ * auVar118._8_4_;
                      auVar195._12_4_ = auVar242._12_4_ * auVar118._12_4_;
                      auVar89 = vsubps_avx(auVar195,auVar173);
                      auVar118 = vshufps_avx(auVar89,auVar89,0xc9);
                      auVar143 = vshufps_avx(auVar128,auVar128,0xc9);
                      auVar196._0_4_ = auVar143._0_4_ * auVar118._0_4_;
                      auVar196._4_4_ = auVar143._4_4_ * auVar118._4_4_;
                      auVar196._8_4_ = auVar143._8_4_ * auVar118._8_4_;
                      auVar196._12_4_ = auVar143._12_4_ * auVar118._12_4_;
                      auVar118 = vshufps_avx(auVar89,auVar89,0xd2);
                      auVar129._0_4_ = auVar128._0_4_ * auVar118._0_4_;
                      auVar129._4_4_ = auVar128._4_4_ * auVar118._4_4_;
                      auVar129._8_4_ = auVar128._8_4_ * auVar118._8_4_;
                      auVar129._12_4_ = auVar128._12_4_ * auVar118._12_4_;
                      auVar118 = vsubps_avx(auVar196,auVar129);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar227;
                        uVar1 = vextractps_avx(auVar118,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar1;
                        uVar1 = vextractps_avx(auVar118,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
                        *(int *)(ray + k * 4 + 0xe0) = auVar118._0_4_;
                        *(float *)(ray + k * 4 + 0xf0) = fVar229;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_8e0;
                        *(uint *)(ray + k * 4 + 0x120) = uVar69;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_650 = vshufps_avx(auVar81,auVar81,0x55);
                        auVar81 = vshufps_avx(auVar118,auVar118,0x55);
                        auStack_670 = vshufps_avx(auVar118,auVar118,0xaa);
                        local_660 = vshufps_avx(auVar118,auVar118,0);
                        local_680 = (RTCHitN  [16])auVar81;
                        local_640 = ZEXT816(0) << 0x20;
                        local_630 = local_6a0._0_8_;
                        uStack_628 = local_6a0._8_8_;
                        local_620 = local_690._0_8_;
                        uStack_618 = local_690._8_8_;
                        uVar73 = context->user->instID[0];
                        _local_610 = CONCAT44(uVar73,uVar73);
                        _uStack_608 = CONCAT44(uVar73,uVar73);
                        uVar73 = context->user->instPrimID[0];
                        auVar130._4_4_ = uVar73;
                        auVar130._0_4_ = uVar73;
                        auVar130._8_4_ = uVar73;
                        auVar130._12_4_ = uVar73;
                        auStack_600 = auVar130;
                        *(float *)(ray + k * 4 + 0x80) = fVar227;
                        local_800 = *local_968;
                        local_a30.valid = (int *)local_800;
                        local_a30.geometryUserPtr = pGVar4->userPtr;
                        local_a30.context = context->user;
                        local_a30.hit = local_680;
                        local_a30.N = 4;
                        local_a30.ray = (RTCRayN *)ray;
                        if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar4->intersectionFilterN)(&local_a30);
                          auVar303._8_56_ = extraout_var_00;
                          auVar303._0_8_ = extraout_XMM1_Qa_00;
                          auVar130 = auVar303._0_16_;
                          auVar303 = ZEXT3264(local_9e0);
                          auVar250 = ZEXT3264(local_9c0);
                          auVar322 = ZEXT3264(local_9a0);
                        }
                        if (local_800 == (undefined1  [16])0x0) {
                          auVar81 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                          auVar118 = vpcmpeqd_avx(auVar130,auVar130);
                          auVar81 = auVar81 ^ auVar118;
                        }
                        else {
                          p_Var5 = context->args->filter;
                          auVar118 = vpcmpeqd_avx(auVar81,auVar81);
                          if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var5)(&local_a30);
                            auVar303 = ZEXT3264(local_9e0);
                            auVar250 = ZEXT3264(local_9c0);
                            auVar322 = ZEXT3264(local_9a0);
                            auVar118 = vpcmpeqd_avx(auVar118,auVar118);
                          }
                          auVar143 = vpcmpeqd_avx(local_800,_DAT_01f7aa10);
                          auVar81 = auVar143 ^ auVar118;
                          if (local_800 != (undefined1  [16])0x0) {
                            auVar143 = auVar143 ^ auVar118;
                            auVar118 = vmaskmovps_avx(auVar143,*(undefined1 (*) [16])local_a30.hit);
                            *(undefined1 (*) [16])(local_a30.ray + 0xc0) = auVar118;
                            auVar118 = vmaskmovps_avx(auVar143,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x10));
                            *(undefined1 (*) [16])(local_a30.ray + 0xd0) = auVar118;
                            auVar118 = vmaskmovps_avx(auVar143,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x20));
                            *(undefined1 (*) [16])(local_a30.ray + 0xe0) = auVar118;
                            auVar118 = vmaskmovps_avx(auVar143,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x30));
                            *(undefined1 (*) [16])(local_a30.ray + 0xf0) = auVar118;
                            auVar118 = vmaskmovps_avx(auVar143,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x40));
                            *(undefined1 (*) [16])(local_a30.ray + 0x100) = auVar118;
                            auVar118 = vmaskmovps_avx(auVar143,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x50));
                            *(undefined1 (*) [16])(local_a30.ray + 0x110) = auVar118;
                            auVar118 = vmaskmovps_avx(auVar143,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x60));
                            *(undefined1 (*) [16])(local_a30.ray + 0x120) = auVar118;
                            auVar118 = vmaskmovps_avx(auVar143,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x70));
                            *(undefined1 (*) [16])(local_a30.ray + 0x130) = auVar118;
                            auVar118 = vmaskmovps_avx(auVar143,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x80));
                            *(undefined1 (*) [16])(local_a30.ray + 0x140) = auVar118;
                          }
                        }
                        auVar92._8_8_ = 0x100000001;
                        auVar92._0_8_ = 0x100000001;
                        if ((auVar92 & auVar81) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar179;
                        }
                      }
                    }
                  }
                }
                break;
              }
            }
            lVar75 = lVar75 + -1;
            auVar250 = ZEXT3264(local_9c0);
          } while (lVar75 != 0);
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar101._4_4_ = uVar1;
          auVar101._0_4_ = uVar1;
          auVar101._8_4_ = uVar1;
          auVar101._12_4_ = uVar1;
          auVar101._16_4_ = uVar1;
          auVar101._20_4_ = uVar1;
          auVar101._24_4_ = uVar1;
          auVar101._28_4_ = uVar1;
          auVar219 = vcmpps_avx(_local_780,auVar101,2);
          auVar94 = vandps_avx(auVar219,local_840);
          auVar219 = local_840 & auVar219;
        } while ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (auVar219 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar219 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(auVar219 >> 0x7f,0) != '\0') ||
                   (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(auVar219 >> 0xbf,0) != '\0') ||
                 (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 auVar219[0x1f] < '\0');
        local_840 = auVar94;
      }
      auVar94 = vandps_avx(local_500,_local_4e0);
      auVar219 = vandps_avx(_local_7c0,_local_7a0);
      auVar202._0_4_ = (float)local_8a0 + local_3e0._0_4_;
      auVar202._4_4_ = local_8a0._4_4_ + local_3e0._4_4_;
      auVar202._8_4_ = (float)uStack_898 + local_3e0._8_4_;
      auVar202._12_4_ = uStack_898._4_4_ + local_3e0._12_4_;
      auVar202._16_4_ = (float)uStack_890 + local_3e0._16_4_;
      auVar202._20_4_ = uStack_890._4_4_ + local_3e0._20_4_;
      auVar202._24_4_ = (float)uStack_888 + local_3e0._24_4_;
      auVar202._28_4_ = uStack_888._4_4_ + local_3e0._28_4_;
      auVar95 = vcmpps_avx(auVar202,auVar101,2);
      auVar94 = vandps_avx(auVar95,auVar94);
      auVar203._0_4_ = (float)local_8a0 + local_3a0._0_4_;
      auVar203._4_4_ = local_8a0._4_4_ + local_3a0._4_4_;
      auVar203._8_4_ = (float)uStack_898 + local_3a0._8_4_;
      auVar203._12_4_ = uStack_898._4_4_ + local_3a0._12_4_;
      auVar203._16_4_ = (float)uStack_890 + local_3a0._16_4_;
      auVar203._20_4_ = uStack_890._4_4_ + local_3a0._20_4_;
      auVar203._24_4_ = (float)uStack_888 + local_3a0._24_4_;
      auVar203._28_4_ = uStack_888._4_4_ + local_3a0._28_4_;
      auVar95 = vcmpps_avx(auVar203,auVar101,2);
      auVar219 = vandps_avx(auVar95,auVar219);
      auVar219 = vorps_avx(auVar94,auVar219);
      if ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar219 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar219 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar219 >> 0x7f,0) != '\0') ||
            (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar219 >> 0xbf,0) != '\0') ||
          (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar219[0x1f] < '\0') {
        *(undefined1 (*) [32])(auStack_180 + uVar76 * 0x60) = auVar219;
        auVar94 = vblendvps_avx(local_3a0,_local_3e0,auVar94);
        *(undefined1 (*) [32])(auStack_160 + uVar76 * 0x60) = auVar94;
        uVar2 = vmovlps_avx(local_490);
        (&uStack_140)[uVar76 * 0xc] = uVar2;
        aiStack_138[uVar76 * 0x18] = local_c08 + 1;
        iVar78 = iVar78 + 1;
      }
    }
    auVar219 = local_420;
    if (iVar78 == 0) break;
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar98._4_4_ = uVar1;
    auVar98._0_4_ = uVar1;
    auVar98._8_4_ = uVar1;
    auVar98._12_4_ = uVar1;
    auVar98._16_4_ = uVar1;
    auVar98._20_4_ = uVar1;
    auVar98._24_4_ = uVar1;
    auVar98._28_4_ = uVar1;
    uVar73 = -iVar78;
    pauVar71 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar78 - 1) * 0x60);
    while( true ) {
      auVar94 = pauVar71[1];
      auVar133._0_4_ = (float)local_8a0 + auVar94._0_4_;
      auVar133._4_4_ = local_8a0._4_4_ + auVar94._4_4_;
      auVar133._8_4_ = (float)uStack_898 + auVar94._8_4_;
      auVar133._12_4_ = uStack_898._4_4_ + auVar94._12_4_;
      auVar133._16_4_ = (float)uStack_890 + auVar94._16_4_;
      auVar133._20_4_ = uStack_890._4_4_ + auVar94._20_4_;
      auVar133._24_4_ = (float)uStack_888 + auVar94._24_4_;
      auVar133._28_4_ = uStack_888._4_4_ + auVar94._28_4_;
      auVar131 = vcmpps_avx(auVar133,auVar98,2);
      auVar95 = vandps_avx(auVar131,*pauVar71);
      _local_680 = auVar95;
      auVar131 = *pauVar71 & auVar131;
      if ((((((((auVar131 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar131 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar131 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar131 >> 0x7f,0) != '\0') ||
            (auVar131 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar131 >> 0xbf,0) != '\0') ||
          (auVar131 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar131[0x1f] < '\0') break;
      pauVar71 = pauVar71 + -3;
      uVar73 = uVar73 + 1;
      if (uVar73 == 0) goto LAB_00ea55bc;
    }
    auVar99._8_4_ = 0x7f800000;
    auVar99._0_8_ = 0x7f8000007f800000;
    auVar99._12_4_ = 0x7f800000;
    auVar99._16_4_ = 0x7f800000;
    auVar99._20_4_ = 0x7f800000;
    auVar99._24_4_ = 0x7f800000;
    auVar99._28_4_ = 0x7f800000;
    auVar94 = vblendvps_avx(auVar99,auVar94,auVar95);
    auVar131 = vshufps_avx(auVar94,auVar94,0xb1);
    auVar131 = vminps_avx(auVar94,auVar131);
    auVar151 = vshufpd_avx(auVar131,auVar131,5);
    auVar131 = vminps_avx(auVar131,auVar151);
    auVar151 = vperm2f128_avx(auVar131,auVar131,1);
    auVar131 = vminps_avx(auVar131,auVar151);
    auVar94 = vcmpps_avx(auVar94,auVar131,0);
    auVar131 = auVar95 & auVar94;
    if ((((((((auVar131 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar131 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar131 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar131 >> 0x7f,0) != '\0') ||
          (auVar131 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar131 >> 0xbf,0) != '\0') ||
        (auVar131 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar131[0x1f] < '\0') {
      auVar95 = vandps_avx(auVar94,auVar95);
    }
    auVar84._8_8_ = 0;
    auVar84._0_8_ = *(ulong *)pauVar71[2];
    local_c08 = *(uint *)(pauVar71[2] + 8);
    uVar74 = vmovmskps_avx(auVar95);
    uVar70 = 0;
    if (uVar74 != 0) {
      for (; (uVar74 >> uVar70 & 1) == 0; uVar70 = uVar70 + 1) {
      }
    }
    *(undefined4 *)(local_680 + (ulong)uVar70 * 4) = 0;
    *pauVar71 = _local_680;
    uVar74 = ~uVar73;
    if ((((((((_local_680 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_680 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_680 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_680 >> 0x7f,0) != '\0') ||
          (_local_680 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_680 >> 0xbf,0) != '\0') ||
        (_local_680 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_680[0x1f] < '\0') {
      uVar74 = -uVar73;
    }
    uVar76 = (ulong)uVar74;
    auVar81 = vshufps_avx(auVar84,auVar84,0);
    auVar118 = vshufps_avx(auVar84,auVar84,0x55);
    auVar118 = vsubps_avx(auVar118,auVar81);
    local_3e0._4_4_ = auVar81._4_4_ + auVar118._4_4_ * 0.14285715;
    local_3e0._0_4_ = auVar81._0_4_ + auVar118._0_4_ * 0.0;
    fStack_3d8 = auVar81._8_4_ + auVar118._8_4_ * 0.2857143;
    fStack_3d4 = auVar81._12_4_ + auVar118._12_4_ * 0.42857146;
    fStack_3d0 = auVar81._0_4_ + auVar118._0_4_ * 0.5714286;
    fStack_3cc = auVar81._4_4_ + auVar118._4_4_ * 0.71428573;
    fStack_3c8 = auVar81._8_4_ + auVar118._8_4_ * 0.8571429;
    fStack_3c4 = auVar81._12_4_ + auVar118._12_4_;
    local_490._8_8_ = 0;
    local_490._0_8_ = *(ulong *)(local_3e0 + (ulong)uVar70 * 4);
  } while( true );
LAB_00ea55bc:
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar93._4_4_ = uVar1;
  auVar93._0_4_ = uVar1;
  auVar93._8_4_ = uVar1;
  auVar93._12_4_ = uVar1;
  auVar9 = vcmpps_avx(local_4a0,auVar93,2);
  uVar69 = vmovmskps_avx(auVar9);
  uVar69 = (uint)uVar77 & uVar69;
  if (uVar69 == 0) {
    return;
  }
  goto LAB_00ea28d6;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }